

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersector1<8>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  bool bVar24;
  byte bVar25;
  uint uVar26;
  ulong uVar27;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  undefined8 unaff_RBP;
  ulong uVar32;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar66 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  float fVar94;
  undefined4 uVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar100;
  float t1;
  undefined1 auVar101 [16];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  vfloat4 b0;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 in_ZMM4 [64];
  vfloat4 b0_1;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  vfloat4 a0_2;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar187;
  float fVar198;
  float fVar200;
  float fVar202;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar199;
  float fVar201;
  float fVar203;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar215;
  float fVar216;
  vfloat4 a0;
  undefined1 auVar208 [16];
  float fVar217;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  vfloat4 a0_1;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 in_ZMM17 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_31c;
  undefined1 local_318 [16];
  ulong local_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  float local_180;
  undefined8 local_17c;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar28;
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar225 [32];
  
  uVar27 = (ulong)(byte)prim[1];
  fVar206 = *(float *)(prim + uVar27 * 0x19 + 0x12);
  auVar75._16_16_ =
       vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                  *(undefined1 (*) [16])(prim + uVar27 * 0x19 + 6));
  fVar102 = fVar206 * auVar75._16_4_;
  fVar94 = fVar206 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar27 * 4 + 6);
  auVar63 = vpmovsxbd_avx2(auVar38);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar27 * 5 + 6);
  auVar61 = vpmovsxbd_avx2(auVar51);
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar27 * 6 + 6);
  auVar68 = vpmovsxbd_avx2(auVar50);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar27 * 0xb + 6);
  auVar78 = vpmovsxbd_avx2(auVar49);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar27 * 0xc + 6);
  auVar79 = vpmovsxbd_avx2(auVar48);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar27 * 0xd + 6);
  auVar62 = vpmovsxbd_avx2(auVar47);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar27 * 0x12 + 6);
  auVar69 = vpmovsxbd_avx2(auVar46);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar27 * 0x13 + 6);
  auVar70 = vpmovsxbd_avx2(auVar45);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar27 * 0x14 + 6);
  auVar72 = vpmovsxbd_avx2(auVar41);
  auVar71 = vcvtdq2ps_avx(auVar72);
  auVar139._4_4_ = fVar94;
  auVar139._0_4_ = fVar94;
  auVar139._8_4_ = fVar94;
  auVar139._12_4_ = fVar94;
  auVar139._16_4_ = fVar94;
  auVar139._20_4_ = fVar94;
  auVar139._24_4_ = fVar94;
  auVar139._28_4_ = fVar94;
  auVar230._8_4_ = 1;
  auVar230._0_8_ = 0x100000001;
  auVar230._12_4_ = 1;
  auVar230._16_4_ = 1;
  auVar230._20_4_ = 1;
  auVar230._24_4_ = 1;
  auVar230._28_4_ = 1;
  auVar58 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar60 = ZEXT1632(CONCAT412(fVar206 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar206 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar206 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar94))));
  auVar73 = vpermps_avx2(auVar230,auVar60);
  auVar59 = vpermps_avx512vl(auVar58,auVar60);
  fVar94 = auVar59._0_4_;
  auVar231._0_4_ = fVar94 * auVar68._0_4_;
  fVar199 = auVar59._4_4_;
  auVar231._4_4_ = fVar199 * auVar68._4_4_;
  fVar201 = auVar59._8_4_;
  auVar231._8_4_ = fVar201 * auVar68._8_4_;
  fVar203 = auVar59._12_4_;
  auVar231._12_4_ = fVar203 * auVar68._12_4_;
  fVar204 = auVar59._16_4_;
  auVar231._16_4_ = fVar204 * auVar68._16_4_;
  fVar205 = auVar59._20_4_;
  auVar231._20_4_ = fVar205 * auVar68._20_4_;
  fVar100 = auVar59._24_4_;
  auVar231._28_36_ = in_ZMM4._28_36_;
  auVar231._24_4_ = fVar100 * auVar68._24_4_;
  auVar60._4_4_ = auVar62._4_4_ * fVar199;
  auVar60._0_4_ = auVar62._0_4_ * fVar94;
  auVar60._8_4_ = auVar62._8_4_ * fVar201;
  auVar60._12_4_ = auVar62._12_4_ * fVar203;
  auVar60._16_4_ = auVar62._16_4_ * fVar204;
  auVar60._20_4_ = auVar62._20_4_ * fVar205;
  auVar60._24_4_ = auVar62._24_4_ * fVar100;
  auVar60._28_4_ = auVar72._28_4_;
  auVar72._4_4_ = auVar71._4_4_ * fVar199;
  auVar72._0_4_ = auVar71._0_4_ * fVar94;
  auVar72._8_4_ = auVar71._8_4_ * fVar201;
  auVar72._12_4_ = auVar71._12_4_ * fVar203;
  auVar72._16_4_ = auVar71._16_4_ * fVar204;
  auVar72._20_4_ = auVar71._20_4_ * fVar205;
  auVar72._24_4_ = auVar71._24_4_ * fVar100;
  auVar72._28_4_ = auVar59._28_4_;
  auVar38 = vfmadd231ps_fma(auVar231._0_32_,auVar73,auVar61);
  auVar51 = vfmadd231ps_fma(auVar60,auVar73,auVar79);
  auVar50 = vfmadd231ps_fma(auVar72,auVar70,auVar73);
  auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar139,auVar63);
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar139,auVar78);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar69,auVar139);
  auVar221._4_4_ = fVar102;
  auVar221._0_4_ = fVar102;
  auVar221._8_4_ = fVar102;
  auVar221._12_4_ = fVar102;
  auVar221._16_4_ = fVar102;
  auVar221._20_4_ = fVar102;
  auVar221._24_4_ = fVar102;
  auVar221._28_4_ = fVar102;
  auVar73 = ZEXT1632(CONCAT412(fVar206 * auVar75._28_4_,
                               CONCAT48(fVar206 * auVar75._24_4_,
                                        CONCAT44(fVar206 * auVar75._20_4_,fVar102))));
  auVar72 = vpermps_avx2(auVar230,auVar73);
  auVar60 = vpermps_avx512vl(auVar58,auVar73);
  fVar206 = auVar60._0_4_;
  fVar94 = auVar60._4_4_;
  auVar73._4_4_ = fVar94 * auVar68._4_4_;
  auVar73._0_4_ = fVar206 * auVar68._0_4_;
  fVar199 = auVar60._8_4_;
  auVar73._8_4_ = fVar199 * auVar68._8_4_;
  fVar201 = auVar60._12_4_;
  auVar73._12_4_ = fVar201 * auVar68._12_4_;
  fVar203 = auVar60._16_4_;
  auVar73._16_4_ = fVar203 * auVar68._16_4_;
  fVar204 = auVar60._20_4_;
  auVar73._20_4_ = fVar204 * auVar68._20_4_;
  fVar205 = auVar60._24_4_;
  auVar73._24_4_ = fVar205 * auVar68._24_4_;
  auVar73._28_4_ = 1;
  auVar58._4_4_ = auVar62._4_4_ * fVar94;
  auVar58._0_4_ = auVar62._0_4_ * fVar206;
  auVar58._8_4_ = auVar62._8_4_ * fVar199;
  auVar58._12_4_ = auVar62._12_4_ * fVar201;
  auVar58._16_4_ = auVar62._16_4_ * fVar203;
  auVar58._20_4_ = auVar62._20_4_ * fVar204;
  auVar58._24_4_ = auVar62._24_4_ * fVar205;
  auVar58._28_4_ = auVar68._28_4_;
  auVar62._4_4_ = auVar71._4_4_ * fVar94;
  auVar62._0_4_ = auVar71._0_4_ * fVar206;
  auVar62._8_4_ = auVar71._8_4_ * fVar199;
  auVar62._12_4_ = auVar71._12_4_ * fVar201;
  auVar62._16_4_ = auVar71._16_4_ * fVar203;
  auVar62._20_4_ = auVar71._20_4_ * fVar204;
  auVar62._24_4_ = auVar71._24_4_ * fVar205;
  auVar62._28_4_ = auVar60._28_4_;
  auVar49 = vfmadd231ps_fma(auVar73,auVar72,auVar61);
  auVar48 = vfmadd231ps_fma(auVar58,auVar72,auVar79);
  auVar47 = vfmadd231ps_fma(auVar62,auVar72,auVar70);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar221,auVar63);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar221,auVar78);
  auVar81._8_4_ = 0x7fffffff;
  auVar81._0_8_ = 0x7fffffff7fffffff;
  auVar81._12_4_ = 0x7fffffff;
  auVar81._16_4_ = 0x7fffffff;
  auVar81._20_4_ = 0x7fffffff;
  auVar81._24_4_ = 0x7fffffff;
  auVar81._28_4_ = 0x7fffffff;
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar221,auVar69);
  auVar63 = vandps_avx(ZEXT1632(auVar38),auVar81);
  auVar126._8_4_ = 0x219392ef;
  auVar126._0_8_ = 0x219392ef219392ef;
  auVar126._12_4_ = 0x219392ef;
  auVar126._16_4_ = 0x219392ef;
  auVar126._20_4_ = 0x219392ef;
  auVar126._24_4_ = 0x219392ef;
  auVar126._28_4_ = 0x219392ef;
  uVar32 = vcmpps_avx512vl(auVar63,auVar126,1);
  bVar36 = (bool)((byte)uVar32 & 1);
  auVar59._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar38._0_4_;
  bVar36 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar59._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar38._4_4_;
  bVar36 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar59._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar38._8_4_;
  bVar36 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar59._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar38._12_4_;
  auVar59._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar59._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar59._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar59._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar63 = vandps_avx(ZEXT1632(auVar51),auVar81);
  uVar32 = vcmpps_avx512vl(auVar63,auVar126,1);
  bVar36 = (bool)((byte)uVar32 & 1);
  auVar74._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar51._0_4_;
  bVar36 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar51._4_4_;
  bVar36 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar51._8_4_;
  bVar36 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar51._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar63 = vandps_avx(ZEXT1632(auVar50),auVar81);
  uVar32 = vcmpps_avx512vl(auVar63,auVar126,1);
  bVar36 = (bool)((byte)uVar32 & 1);
  auVar63._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar50._0_4_;
  bVar36 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar50._4_4_;
  bVar36 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar50._8_4_;
  bVar36 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar50._12_4_;
  auVar63._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * 0x219392ef;
  auVar63._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * 0x219392ef;
  auVar63._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * 0x219392ef;
  auVar63._28_4_ = (uint)(byte)(uVar32 >> 7) * 0x219392ef;
  auVar61 = vrcp14ps_avx512vl(auVar59);
  auVar82._8_4_ = 0x3f800000;
  auVar82._0_8_ = 0x3f8000003f800000;
  auVar82._12_4_ = 0x3f800000;
  auVar82._16_4_ = 0x3f800000;
  auVar82._20_4_ = 0x3f800000;
  auVar82._24_4_ = 0x3f800000;
  auVar82._28_4_ = 0x3f800000;
  auVar38 = vfnmadd213ps_fma(auVar59,auVar61,auVar82);
  auVar38 = vfmadd132ps_fma(ZEXT1632(auVar38),auVar61,auVar61);
  auVar61 = vrcp14ps_avx512vl(auVar74);
  auVar51 = vfnmadd213ps_fma(auVar74,auVar61,auVar82);
  auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar61,auVar61);
  auVar61 = vrcp14ps_avx512vl(auVar63);
  auVar50 = vfnmadd213ps_fma(auVar63,auVar61,auVar82);
  auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar61,auVar61);
  auVar63 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar27 * 7 + 6));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,ZEXT1632(auVar49));
  auVar69._4_4_ = auVar38._4_4_ * auVar63._4_4_;
  auVar69._0_4_ = auVar38._0_4_ * auVar63._0_4_;
  auVar69._8_4_ = auVar38._8_4_ * auVar63._8_4_;
  auVar69._12_4_ = auVar38._12_4_ * auVar63._12_4_;
  auVar69._16_4_ = auVar63._16_4_ * 0.0;
  auVar69._20_4_ = auVar63._20_4_ * 0.0;
  auVar69._24_4_ = auVar63._24_4_ * 0.0;
  auVar69._28_4_ = auVar63._28_4_;
  auVar63 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar27 * 9 + 6));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,ZEXT1632(auVar49));
  auVar80._0_4_ = auVar38._0_4_ * auVar63._0_4_;
  auVar80._4_4_ = auVar38._4_4_ * auVar63._4_4_;
  auVar80._8_4_ = auVar38._8_4_ * auVar63._8_4_;
  auVar80._12_4_ = auVar38._12_4_ * auVar63._12_4_;
  auVar80._16_4_ = auVar63._16_4_ * 0.0;
  auVar80._20_4_ = auVar63._20_4_ * 0.0;
  auVar80._24_4_ = auVar63._24_4_ * 0.0;
  auVar80._28_4_ = 0;
  auVar63 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar27 * 0xe + 6));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,ZEXT1632(auVar48));
  auVar70._4_4_ = auVar51._4_4_ * auVar63._4_4_;
  auVar70._0_4_ = auVar51._0_4_ * auVar63._0_4_;
  auVar70._8_4_ = auVar51._8_4_ * auVar63._8_4_;
  auVar70._12_4_ = auVar51._12_4_ * auVar63._12_4_;
  auVar70._16_4_ = auVar63._16_4_ * 0.0;
  auVar70._20_4_ = auVar63._20_4_ * 0.0;
  auVar70._24_4_ = auVar63._24_4_ * 0.0;
  auVar70._28_4_ = auVar63._28_4_;
  auVar62 = vpbroadcastd_avx512vl();
  auVar63 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,ZEXT1632(auVar48));
  auVar77._0_4_ = auVar51._0_4_ * auVar63._0_4_;
  auVar77._4_4_ = auVar51._4_4_ * auVar63._4_4_;
  auVar77._8_4_ = auVar51._8_4_ * auVar63._8_4_;
  auVar77._12_4_ = auVar51._12_4_ * auVar63._12_4_;
  auVar77._16_4_ = auVar63._16_4_ * 0.0;
  auVar77._20_4_ = auVar63._20_4_ * 0.0;
  auVar77._24_4_ = auVar63._24_4_ * 0.0;
  auVar77._28_4_ = 0;
  auVar63 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar27 * 0x15 + 6));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,ZEXT1632(auVar47));
  auVar71._4_4_ = auVar63._4_4_ * auVar50._4_4_;
  auVar71._0_4_ = auVar63._0_4_ * auVar50._0_4_;
  auVar71._8_4_ = auVar63._8_4_ * auVar50._8_4_;
  auVar71._12_4_ = auVar63._12_4_ * auVar50._12_4_;
  auVar71._16_4_ = auVar63._16_4_ * 0.0;
  auVar71._20_4_ = auVar63._20_4_ * 0.0;
  auVar71._24_4_ = auVar63._24_4_ * 0.0;
  auVar71._28_4_ = auVar63._28_4_;
  auVar63 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar27 * 0x17 + 6));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar63 = vsubps_avx(auVar63,ZEXT1632(auVar47));
  auVar76._0_4_ = auVar50._0_4_ * auVar63._0_4_;
  auVar76._4_4_ = auVar50._4_4_ * auVar63._4_4_;
  auVar76._8_4_ = auVar50._8_4_ * auVar63._8_4_;
  auVar76._12_4_ = auVar50._12_4_ * auVar63._12_4_;
  auVar76._16_4_ = auVar63._16_4_ * 0.0;
  auVar76._20_4_ = auVar63._20_4_ * 0.0;
  auVar76._24_4_ = auVar63._24_4_ * 0.0;
  auVar76._28_4_ = 0;
  auVar63 = vpminsd_avx2(auVar69,auVar80);
  auVar61 = vpminsd_avx2(auVar70,auVar77);
  auVar63 = vmaxps_avx(auVar63,auVar61);
  auVar61 = vpminsd_avx2(auVar71,auVar76);
  uVar95 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar68._4_4_ = uVar95;
  auVar68._0_4_ = uVar95;
  auVar68._8_4_ = uVar95;
  auVar68._12_4_ = uVar95;
  auVar68._16_4_ = uVar95;
  auVar68._20_4_ = uVar95;
  auVar68._24_4_ = uVar95;
  auVar68._28_4_ = uVar95;
  auVar61 = vmaxps_avx512vl(auVar61,auVar68);
  auVar63 = vmaxps_avx(auVar63,auVar61);
  auVar61._8_4_ = 0x3f7ffffa;
  auVar61._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar61._12_4_ = 0x3f7ffffa;
  auVar61._16_4_ = 0x3f7ffffa;
  auVar61._20_4_ = 0x3f7ffffa;
  auVar61._24_4_ = 0x3f7ffffa;
  auVar61._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar63,auVar61);
  auVar63 = vpmaxsd_avx2(auVar69,auVar80);
  auVar61 = vpmaxsd_avx2(auVar70,auVar77);
  auVar63 = vminps_avx(auVar63,auVar61);
  auVar61 = vpmaxsd_avx2(auVar71,auVar76);
  fVar206 = (ray->super_RayK<1>).tfar;
  auVar78._4_4_ = fVar206;
  auVar78._0_4_ = fVar206;
  auVar78._8_4_ = fVar206;
  auVar78._12_4_ = fVar206;
  auVar78._16_4_ = fVar206;
  auVar78._20_4_ = fVar206;
  auVar78._24_4_ = fVar206;
  auVar78._28_4_ = fVar206;
  auVar61 = vminps_avx512vl(auVar61,auVar78);
  auVar63 = vminps_avx(auVar63,auVar61);
  auVar79._8_4_ = 0x3f800003;
  auVar79._0_8_ = 0x3f8000033f800003;
  auVar79._12_4_ = 0x3f800003;
  auVar79._16_4_ = 0x3f800003;
  auVar79._20_4_ = 0x3f800003;
  auVar79._24_4_ = 0x3f800003;
  auVar79._28_4_ = 0x3f800003;
  auVar63 = vmulps_avx512vl(auVar63,auVar79);
  uVar10 = vcmpps_avx512vl(local_78,auVar63,2);
  uVar11 = vpcmpgtd_avx512vl(auVar62,_DAT_01fb4ba0);
  uVar32 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),(uint)(byte)((byte)uVar10 & (byte)uVar11));
  auVar75._16_16_ = auVar63._16_16_;
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar241 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar231 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar232 = ZEXT1664(auVar38);
  auVar240 = ZEXT464(0x3f800000);
LAB_01a5db6b:
  if (uVar32 == 0) {
    return;
  }
  lVar29 = 0;
  for (uVar27 = uVar32; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    lVar29 = lVar29 + 1;
  }
  uVar4 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  local_300 = (ulong)*(uint *)(prim + lVar29 * 4 + 6);
  uVar27 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar29 * 4 + 6));
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar38 = *(undefined1 (*) [16])(_Var9 + uVar27 * (long)pvVar8);
  auVar51 = *(undefined1 (*) [16])(_Var9 + (uVar27 + 1) * (long)pvVar8);
  auVar50 = *(undefined1 (*) [16])(_Var9 + (uVar27 + 2) * (long)pvVar8);
  auVar49 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar27 + 3));
  lVar29 = *(long *)&pGVar6[1].time_range.upper;
  auVar48 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * uVar27);
  auVar47 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * (uVar27 + 1));
  auVar46 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * (uVar27 + 2));
  uVar32 = uVar32 - 1 & uVar32;
  auVar45 = *(undefined1 (*) [16])(lVar29 + (long)p_Var7 * (uVar27 + 3));
  if (uVar32 != 0) {
    uVar33 = uVar32 - 1 & uVar32;
    for (uVar27 = uVar32; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
    }
    if (uVar33 != 0) {
      for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar105 = auVar241._0_16_;
  auVar39 = vmulps_avx512vl(auVar45,auVar105);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar46,auVar39);
  auVar40._0_4_ = auVar47._0_4_ + auVar41._0_4_;
  auVar40._4_4_ = auVar47._4_4_ + auVar41._4_4_;
  auVar40._8_4_ = auVar47._8_4_ + auVar41._8_4_;
  auVar40._12_4_ = auVar47._12_4_ + auVar41._12_4_;
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar48,auVar105);
  auVar65._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar41 = vmulps_avx512vl(auVar45,auVar65._0_16_);
  auVar57 = auVar231._0_16_;
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar46,auVar57);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar47,auVar65._0_16_);
  auVar42 = vfnmadd231ps_avx512vl(auVar41,auVar48,auVar57);
  auVar43 = vmulps_avx512vl(auVar49,auVar105);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar50,auVar43);
  auVar208._0_4_ = auVar41._0_4_ + auVar51._0_4_;
  auVar208._4_4_ = auVar41._4_4_ + auVar51._4_4_;
  auVar208._8_4_ = auVar41._8_4_ + auVar51._8_4_;
  auVar208._12_4_ = auVar41._12_4_ + auVar51._12_4_;
  auVar41 = vfmadd231ps_avx512vl(auVar208,auVar38,auVar105);
  auVar44 = vmulps_avx512vl(auVar49,auVar65._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar50,auVar57);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar51,auVar65._0_16_);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar38,auVar57);
  auVar54._0_4_ = auVar46._0_4_ + auVar39._0_4_;
  auVar54._4_4_ = auVar46._4_4_ + auVar39._4_4_;
  auVar54._8_4_ = auVar46._8_4_ + auVar39._8_4_;
  auVar54._12_4_ = auVar46._12_4_ + auVar39._12_4_;
  auVar39 = vfmadd231ps_avx512vl(auVar54,auVar47,auVar65._0_16_);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar48,auVar105);
  auVar45 = vmulps_avx512vl(auVar45,auVar57);
  auVar46 = vfmadd231ps_avx512vl(auVar45,auVar65._0_16_,auVar46);
  auVar47 = vfnmadd231ps_avx512vl(auVar46,auVar57,auVar47);
  auVar46 = vfmadd231ps_avx512vl(auVar47,auVar65._0_16_,auVar48);
  auVar159._0_4_ = auVar43._0_4_ + auVar50._0_4_;
  auVar159._4_4_ = auVar43._4_4_ + auVar50._4_4_;
  auVar159._8_4_ = auVar43._8_4_ + auVar50._8_4_;
  auVar159._12_4_ = auVar43._12_4_ + auVar50._12_4_;
  auVar48 = vfmadd231ps_avx512vl(auVar159,auVar51,auVar65._0_16_);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar38,auVar105);
  auVar49 = vmulps_avx512vl(auVar49,auVar57);
  auVar50 = vfmadd231ps_avx512vl(auVar49,auVar65._0_16_,auVar50);
  auVar51 = vfnmadd231ps_avx512vl(auVar50,auVar57,auVar51);
  auVar47 = vfmadd231ps_avx512vl(auVar51,auVar65._0_16_,auVar38);
  auVar38 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar51 = vshufps_avx(auVar41,auVar41,0xc9);
  fVar203 = auVar42._0_4_;
  auVar128._0_4_ = fVar203 * auVar51._0_4_;
  fVar204 = auVar42._4_4_;
  auVar128._4_4_ = fVar204 * auVar51._4_4_;
  fVar205 = auVar42._8_4_;
  auVar128._8_4_ = fVar205 * auVar51._8_4_;
  fVar100 = auVar42._12_4_;
  auVar128._12_4_ = fVar100 * auVar51._12_4_;
  auVar51 = vfmsub231ps_fma(auVar128,auVar38,auVar41);
  auVar50 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar129._0_4_ = fVar203 * auVar51._0_4_;
  auVar129._4_4_ = fVar204 * auVar51._4_4_;
  auVar129._8_4_ = fVar205 * auVar51._8_4_;
  auVar129._12_4_ = fVar100 * auVar51._12_4_;
  auVar38 = vfmsub231ps_fma(auVar129,auVar38,auVar44);
  auVar49 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar51 = vshufps_avx(auVar48,auVar48,0xc9);
  fVar102 = auVar46._0_4_;
  auVar120._0_4_ = fVar102 * auVar51._0_4_;
  fVar117 = auVar46._4_4_;
  auVar120._4_4_ = fVar117 * auVar51._4_4_;
  fVar118 = auVar46._8_4_;
  auVar120._8_4_ = fVar118 * auVar51._8_4_;
  fVar119 = auVar46._12_4_;
  auVar120._12_4_ = fVar119 * auVar51._12_4_;
  auVar51 = vfmsub231ps_fma(auVar120,auVar38,auVar48);
  auVar48 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar160._0_4_ = auVar51._0_4_ * fVar102;
  auVar160._4_4_ = auVar51._4_4_ * fVar117;
  auVar160._8_4_ = auVar51._8_4_ * fVar118;
  auVar160._12_4_ = auVar51._12_4_ * fVar119;
  auVar51 = vfmsub231ps_fma(auVar160,auVar38,auVar47);
  auVar38 = vdpps_avx(auVar50,auVar50,0x7f);
  auVar47 = vshufps_avx(auVar51,auVar51,0xc9);
  fVar94 = auVar38._0_4_;
  auVar65._16_16_ = auVar75._16_16_;
  auVar64._4_28_ = auVar65._4_28_;
  auVar64._0_4_ = fVar94;
  auVar51 = vrsqrt14ss_avx512f(auVar65._0_16_,auVar64._0_16_);
  fVar206 = auVar51._0_4_;
  auVar51 = vdpps_avx(auVar50,auVar49,0x7f);
  fVar206 = fVar206 * 1.5 + fVar94 * -0.5 * fVar206 * fVar206 * fVar206;
  fVar187 = fVar206 * auVar50._0_4_;
  fVar198 = fVar206 * auVar50._4_4_;
  fVar200 = fVar206 * auVar50._8_4_;
  fVar202 = fVar206 * auVar50._12_4_;
  auVar168._0_4_ = auVar49._0_4_ * fVar94;
  auVar168._4_4_ = auVar49._4_4_ * fVar94;
  auVar168._8_4_ = auVar49._8_4_ * fVar94;
  auVar168._12_4_ = auVar49._12_4_ * fVar94;
  fVar94 = auVar51._0_4_;
  auVar142._0_4_ = fVar94 * auVar50._0_4_;
  auVar142._4_4_ = fVar94 * auVar50._4_4_;
  auVar142._8_4_ = fVar94 * auVar50._8_4_;
  auVar142._12_4_ = fVar94 * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar168,auVar142);
  auVar51 = vrcp14ss_avx512f(auVar65._0_16_,auVar64._0_16_);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar51,ZEXT416(0x40000000));
  fVar199 = auVar51._0_4_ * auVar38._0_4_;
  auVar38 = vdpps_avx(auVar48,auVar48,0x7f);
  fVar201 = auVar38._0_4_;
  auVar67._16_16_ = auVar75._16_16_;
  auVar67._0_16_ = auVar65._0_16_;
  auVar66._4_28_ = auVar67._4_28_;
  auVar66._0_4_ = fVar201;
  auVar51 = vrsqrt14ss_avx512f(auVar65._0_16_,auVar66._0_16_);
  fVar94 = auVar51._0_4_;
  fVar94 = fVar94 * 1.5 + fVar201 * -0.5 * fVar94 * fVar94 * fVar94;
  auVar51 = vdpps_avx(auVar48,auVar47,0x7f);
  fVar207 = fVar94 * auVar48._0_4_;
  fVar215 = fVar94 * auVar48._4_4_;
  fVar216 = fVar94 * auVar48._8_4_;
  fVar217 = fVar94 * auVar48._12_4_;
  auVar130._0_4_ = fVar201 * auVar47._0_4_;
  auVar130._4_4_ = fVar201 * auVar47._4_4_;
  auVar130._8_4_ = fVar201 * auVar47._8_4_;
  auVar130._12_4_ = fVar201 * auVar47._12_4_;
  fVar201 = auVar51._0_4_;
  auVar121._0_4_ = fVar201 * auVar48._0_4_;
  auVar121._4_4_ = fVar201 * auVar48._4_4_;
  auVar121._8_4_ = fVar201 * auVar48._8_4_;
  auVar121._12_4_ = fVar201 * auVar48._12_4_;
  auVar49 = vsubps_avx(auVar130,auVar121);
  auVar51 = vrcp14ss_avx512f(auVar65._0_16_,auVar66._0_16_);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar51,ZEXT416(0x40000000));
  fVar201 = auVar51._0_4_ * auVar38._0_4_;
  auVar38 = vshufps_avx(auVar40,auVar40,0xff);
  auVar149._0_4_ = fVar187 * auVar38._0_4_;
  auVar149._4_4_ = fVar198 * auVar38._4_4_;
  auVar149._8_4_ = fVar200 * auVar38._8_4_;
  auVar149._12_4_ = fVar202 * auVar38._12_4_;
  local_1a8 = vsubps_avx(auVar40,auVar149);
  auVar51 = vshufps_avx(auVar42,auVar42,0xff);
  auVar131._0_4_ = auVar51._0_4_ * fVar187 + auVar38._0_4_ * fVar206 * auVar50._0_4_ * fVar199;
  auVar131._4_4_ = auVar51._4_4_ * fVar198 + auVar38._4_4_ * fVar206 * auVar50._4_4_ * fVar199;
  auVar131._8_4_ = auVar51._8_4_ * fVar200 + auVar38._8_4_ * fVar206 * auVar50._8_4_ * fVar199;
  auVar131._12_4_ = auVar51._12_4_ * fVar202 + auVar38._12_4_ * fVar206 * auVar50._12_4_ * fVar199;
  auVar50 = vsubps_avx(auVar42,auVar131);
  local_1b8._0_4_ = auVar40._0_4_ + auVar149._0_4_;
  local_1b8._4_4_ = auVar40._4_4_ + auVar149._4_4_;
  fStack_1b0 = auVar40._8_4_ + auVar149._8_4_;
  fStack_1ac = auVar40._12_4_ + auVar149._12_4_;
  auVar38 = vshufps_avx(auVar39,auVar39,0xff);
  auVar132._0_4_ = fVar207 * auVar38._0_4_;
  auVar132._4_4_ = fVar215 * auVar38._4_4_;
  auVar132._8_4_ = fVar216 * auVar38._8_4_;
  auVar132._12_4_ = fVar217 * auVar38._12_4_;
  local_1c8 = vsubps_avx(auVar39,auVar132);
  auVar51 = vshufps_avx(auVar46,auVar46,0xff);
  auVar57._0_4_ = fVar207 * auVar51._0_4_ + auVar38._0_4_ * fVar94 * auVar49._0_4_ * fVar201;
  auVar57._4_4_ = fVar215 * auVar51._4_4_ + auVar38._4_4_ * fVar94 * auVar49._4_4_ * fVar201;
  auVar57._8_4_ = fVar216 * auVar51._8_4_ + auVar38._8_4_ * fVar94 * auVar49._8_4_ * fVar201;
  auVar57._12_4_ = fVar217 * auVar51._12_4_ + auVar38._12_4_ * fVar94 * auVar49._12_4_ * fVar201;
  auVar38 = vsubps_avx(auVar46,auVar57);
  _local_1d8 = vaddps_avx512vl(auVar39,auVar132);
  auVar55._0_4_ = auVar50._0_4_ * 0.33333334;
  auVar55._4_4_ = auVar50._4_4_ * 0.33333334;
  auVar55._8_4_ = auVar50._8_4_ * 0.33333334;
  auVar55._12_4_ = auVar50._12_4_ * 0.33333334;
  local_1e8 = vaddps_avx512vl(local_1a8,auVar55);
  auVar56._0_4_ = auVar38._0_4_ * 0.33333334;
  auVar56._4_4_ = auVar38._4_4_ * 0.33333334;
  auVar56._8_4_ = auVar38._8_4_ * 0.33333334;
  auVar56._12_4_ = auVar38._12_4_ * 0.33333334;
  local_1f8 = vsubps_avx512vl(local_1c8,auVar56);
  auVar42._0_4_ = (fVar203 + auVar131._0_4_) * 0.33333334;
  auVar42._4_4_ = (fVar204 + auVar131._4_4_) * 0.33333334;
  auVar42._8_4_ = (fVar205 + auVar131._8_4_) * 0.33333334;
  auVar42._12_4_ = (fVar100 + auVar131._12_4_) * 0.33333334;
  _local_208 = vaddps_avx512vl(_local_1b8,auVar42);
  auVar43._0_4_ = (fVar102 + auVar57._0_4_) * 0.33333334;
  auVar43._4_4_ = (fVar117 + auVar57._4_4_) * 0.33333334;
  auVar43._8_4_ = (fVar118 + auVar57._8_4_) * 0.33333334;
  auVar43._12_4_ = (fVar119 + auVar57._12_4_) * 0.33333334;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  _local_218 = vsubps_avx512vl(_local_1d8,auVar43);
  auVar51 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  uVar95 = auVar51._0_4_;
  auVar52._4_4_ = uVar95;
  auVar52._0_4_ = uVar95;
  auVar52._8_4_ = uVar95;
  auVar52._12_4_ = uVar95;
  auVar38 = vshufps_avx(auVar51,auVar51,0x55);
  aVar2 = (pre->ray_space).vx.field_0;
  auVar51 = vshufps_avx(auVar51,auVar51,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar206 = (pre->ray_space).vz.field_0.m128[0];
  fVar94 = (pre->ray_space).vz.field_0.m128[1];
  fVar199 = (pre->ray_space).vz.field_0.m128[2];
  fVar201 = (pre->ray_space).vz.field_0.m128[3];
  auVar44._0_4_ = fVar206 * auVar51._0_4_;
  auVar44._4_4_ = fVar94 * auVar51._4_4_;
  auVar44._8_4_ = fVar199 * auVar51._8_4_;
  auVar44._12_4_ = fVar201 * auVar51._12_4_;
  auVar38 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar3,auVar38);
  auVar48 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar52);
  auVar51 = vsubps_avx512vl(local_1e8,(undefined1  [16])aVar1);
  uVar95 = auVar51._0_4_;
  auVar103._4_4_ = uVar95;
  auVar103._0_4_ = uVar95;
  auVar103._8_4_ = uVar95;
  auVar103._12_4_ = uVar95;
  auVar38 = vshufps_avx(auVar51,auVar51,0x55);
  auVar51 = vshufps_avx(auVar51,auVar51,0xaa);
  auVar53._0_4_ = fVar206 * auVar51._0_4_;
  auVar53._4_4_ = fVar94 * auVar51._4_4_;
  auVar53._8_4_ = fVar199 * auVar51._8_4_;
  auVar53._12_4_ = fVar201 * auVar51._12_4_;
  auVar38 = vfmadd231ps_fma(auVar53,(undefined1  [16])aVar3,auVar38);
  auVar47 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar103);
  auVar51 = vsubps_avx512vl(local_1f8,(undefined1  [16])aVar1);
  uVar95 = auVar51._0_4_;
  auVar150._4_4_ = uVar95;
  auVar150._0_4_ = uVar95;
  auVar150._8_4_ = uVar95;
  auVar150._12_4_ = uVar95;
  auVar38 = vshufps_avx(auVar51,auVar51,0x55);
  auVar51 = vshufps_avx(auVar51,auVar51,0xaa);
  auVar104._0_4_ = fVar206 * auVar51._0_4_;
  auVar104._4_4_ = fVar94 * auVar51._4_4_;
  auVar104._8_4_ = fVar199 * auVar51._8_4_;
  auVar104._12_4_ = fVar201 * auVar51._12_4_;
  auVar38 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar3,auVar38);
  auVar46 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar150);
  auVar51 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  uVar95 = auVar51._0_4_;
  auVar161._4_4_ = uVar95;
  auVar161._0_4_ = uVar95;
  auVar161._8_4_ = uVar95;
  auVar161._12_4_ = uVar95;
  auVar38 = vshufps_avx(auVar51,auVar51,0x55);
  auVar51 = vshufps_avx(auVar51,auVar51,0xaa);
  auVar151._0_4_ = fVar206 * auVar51._0_4_;
  auVar151._4_4_ = fVar94 * auVar51._4_4_;
  auVar151._8_4_ = fVar199 * auVar51._8_4_;
  auVar151._12_4_ = fVar201 * auVar51._12_4_;
  auVar38 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar3,auVar38);
  auVar45 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar161);
  auVar51 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  uVar95 = auVar51._0_4_;
  auVar169._4_4_ = uVar95;
  auVar169._0_4_ = uVar95;
  auVar169._8_4_ = uVar95;
  auVar169._12_4_ = uVar95;
  auVar38 = vshufps_avx(auVar51,auVar51,0x55);
  auVar51 = vshufps_avx(auVar51,auVar51,0xaa);
  auVar162._0_4_ = auVar51._0_4_ * fVar206;
  auVar162._4_4_ = auVar51._4_4_ * fVar94;
  auVar162._8_4_ = auVar51._8_4_ * fVar199;
  auVar162._12_4_ = auVar51._12_4_ * fVar201;
  auVar38 = vfmadd231ps_fma(auVar162,(undefined1  [16])aVar3,auVar38);
  auVar41 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar169);
  auVar51 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar1);
  uVar95 = auVar51._0_4_;
  auVar180._4_4_ = uVar95;
  auVar180._0_4_ = uVar95;
  auVar180._8_4_ = uVar95;
  auVar180._12_4_ = uVar95;
  auVar38 = vshufps_avx(auVar51,auVar51,0x55);
  auVar51 = vshufps_avx(auVar51,auVar51,0xaa);
  auVar170._0_4_ = auVar51._0_4_ * fVar206;
  auVar170._4_4_ = auVar51._4_4_ * fVar94;
  auVar170._8_4_ = auVar51._8_4_ * fVar199;
  auVar170._12_4_ = auVar51._12_4_ * fVar201;
  auVar38 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar3,auVar38);
  auVar75._16_16_ = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar180);
  auVar51 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar1);
  uVar95 = auVar51._0_4_;
  auVar188._4_4_ = uVar95;
  auVar188._0_4_ = uVar95;
  auVar188._8_4_ = uVar95;
  auVar188._12_4_ = uVar95;
  auVar38 = vshufps_avx(auVar51,auVar51,0x55);
  auVar51 = vshufps_avx(auVar51,auVar51,0xaa);
  auVar181._0_4_ = auVar51._0_4_ * fVar206;
  auVar181._4_4_ = auVar51._4_4_ * fVar94;
  auVar181._8_4_ = auVar51._8_4_ * fVar199;
  auVar181._12_4_ = auVar51._12_4_ * fVar201;
  auVar38 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar3,auVar38);
  auVar39 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar188);
  auVar51 = vsubps_avx512vl(_local_1d8,(undefined1  [16])aVar1);
  uVar95 = auVar51._0_4_;
  auVar189._4_4_ = uVar95;
  auVar189._0_4_ = uVar95;
  auVar189._8_4_ = uVar95;
  auVar189._12_4_ = uVar95;
  auVar38 = vshufps_avx(auVar51,auVar51,0x55);
  auVar51 = vshufps_avx(auVar51,auVar51,0xaa);
  auVar122._0_4_ = fVar206 * auVar51._0_4_;
  auVar122._4_4_ = fVar94 * auVar51._4_4_;
  auVar122._8_4_ = fVar199 * auVar51._8_4_;
  auVar122._12_4_ = fVar201 * auVar51._12_4_;
  auVar38 = vfmadd231ps_fma(auVar122,(undefined1  [16])aVar3,auVar38);
  auVar40 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar2,auVar189);
  local_2f8 = vmovlhps_avx512f(auVar48,auVar41);
  auVar237 = ZEXT1664(local_2f8);
  local_258 = vmovlhps_avx(auVar47,auVar75._16_16_);
  local_268 = vmovlhps_avx512f(auVar46,auVar39);
  _local_108 = vmovlhps_avx512f(auVar45,auVar40);
  auVar38 = vminps_avx512vl(local_2f8,local_258);
  auVar50 = vmaxps_avx512vl(local_2f8,local_258);
  auVar51 = vminps_avx512vl(local_268,_local_108);
  auVar51 = vminps_avx(auVar38,auVar51);
  auVar38 = vmaxps_avx512vl(local_268,_local_108);
  auVar38 = vmaxps_avx(auVar50,auVar38);
  auVar50 = vshufpd_avx(auVar51,auVar51,3);
  auVar49 = vshufpd_avx(auVar38,auVar38,3);
  auVar51 = vminps_avx(auVar51,auVar50);
  auVar38 = vmaxps_avx(auVar38,auVar49);
  auVar51 = vandps_avx512vl(auVar51,auVar232._0_16_);
  auVar38 = vandps_avx512vl(auVar38,auVar232._0_16_);
  auVar38 = vmaxps_avx(auVar51,auVar38);
  auVar51 = vmovshdup_avx(auVar38);
  auVar38 = vmaxss_avx(auVar51,auVar38);
  local_278._8_8_ = auVar48._0_8_;
  local_278._0_8_ = auVar48._0_8_;
  local_288 = vmovddup_avx512vl(auVar47);
  local_298 = vmovddup_avx512vl(auVar46);
  local_2a8._0_8_ = auVar45._0_8_;
  local_2a8._8_8_ = local_2a8._0_8_;
  register0x00001348 = auVar41._0_8_;
  local_2b8 = auVar41._0_8_;
  register0x00001388 = auVar75._16_8_;
  local_2c8 = auVar75._16_8_;
  register0x00001408 = auVar39._0_8_;
  local_2d8 = auVar39._0_8_;
  register0x00001448 = auVar40._0_8_;
  local_2e8 = auVar40._0_8_;
  local_118 = ZEXT416((uint)(auVar38._0_4_ * 9.536743e-07));
  local_b8 = vbroadcastss_avx512vl(local_118);
  auVar38 = vxorps_avx512vl(local_b8._0_16_,auVar105);
  local_d8 = vbroadcastss_avx512vl(auVar38);
  local_318 = vsubps_avx512vl(local_258,local_2f8);
  local_e8 = vsubps_avx512vl(local_268,local_258);
  local_f8 = vsubps_avx512vl(_local_108,local_268);
  local_128 = vsubps_avx(_local_1b8,local_1a8);
  local_138 = vsubps_avx512vl(_local_208,local_1e8);
  local_148 = vsubps_avx512vl(_local_218,local_1f8);
  _local_158 = vsubps_avx512vl(_local_1d8,local_1c8);
  uVar27 = 0;
  auVar38 = ZEXT816(0x3f80000000000000);
  auVar39 = auVar38;
LAB_01a5e224:
  auVar239 = ZEXT3264(local_b8);
  auVar51 = vshufps_avx(auVar39,auVar39,0x50);
  auVar222._8_4_ = 0x3f800000;
  auVar222._0_8_ = 0x3f8000003f800000;
  auVar222._12_4_ = 0x3f800000;
  auVar225._16_4_ = 0x3f800000;
  auVar225._0_16_ = auVar222;
  auVar225._20_4_ = 0x3f800000;
  auVar225._24_4_ = 0x3f800000;
  auVar225._28_4_ = 0x3f800000;
  auVar50 = vsubps_avx(auVar222,auVar51);
  fVar206 = auVar51._0_4_;
  auVar123._0_4_ = local_2b8._0_4_ * fVar206;
  fVar94 = auVar51._4_4_;
  auVar123._4_4_ = local_2b8._4_4_ * fVar94;
  fVar199 = auVar51._8_4_;
  auVar123._8_4_ = local_2b8._8_4_ * fVar199;
  fVar201 = auVar51._12_4_;
  auVar123._12_4_ = local_2b8._12_4_ * fVar201;
  auVar133._0_4_ = local_2c8._0_4_ * fVar206;
  auVar133._4_4_ = local_2c8._4_4_ * fVar94;
  auVar133._8_4_ = local_2c8._8_4_ * fVar199;
  auVar133._12_4_ = local_2c8._12_4_ * fVar201;
  auVar143._0_4_ = local_2d8._0_4_ * fVar206;
  auVar143._4_4_ = local_2d8._4_4_ * fVar94;
  auVar143._8_4_ = local_2d8._8_4_ * fVar199;
  auVar143._12_4_ = local_2d8._12_4_ * fVar201;
  auVar105._0_4_ = local_2e8._0_4_ * fVar206;
  auVar105._4_4_ = local_2e8._4_4_ * fVar94;
  auVar105._8_4_ = local_2e8._8_4_ * fVar199;
  auVar105._12_4_ = local_2e8._12_4_ * fVar201;
  auVar49 = vfmadd231ps_fma(auVar123,auVar50,local_278);
  auVar48 = vfmadd231ps_avx512vl(auVar133,auVar50,local_288);
  auVar47 = vfmadd231ps_avx512vl(auVar143,auVar50,local_298);
  auVar50 = vfmadd231ps_fma(auVar105,local_2a8,auVar50);
  auVar51 = vmovshdup_avx(auVar38);
  fVar94 = auVar38._0_4_;
  fVar206 = (auVar51._0_4_ - fVar94) * 0.04761905;
  auVar167._4_4_ = fVar94;
  auVar167._0_4_ = fVar94;
  auVar167._8_4_ = fVar94;
  auVar167._12_4_ = fVar94;
  auVar167._16_4_ = fVar94;
  auVar167._20_4_ = fVar94;
  auVar167._24_4_ = fVar94;
  auVar167._28_4_ = fVar94;
  auVar115._0_8_ = auVar51._0_8_;
  auVar115._8_8_ = auVar115._0_8_;
  auVar115._16_8_ = auVar115._0_8_;
  auVar115._24_8_ = auVar115._0_8_;
  auVar63 = vsubps_avx(auVar115,auVar167);
  uVar95 = auVar49._0_4_;
  auVar116._4_4_ = uVar95;
  auVar116._0_4_ = uVar95;
  auVar116._8_4_ = uVar95;
  auVar116._12_4_ = uVar95;
  auVar116._16_4_ = uVar95;
  auVar116._20_4_ = uVar95;
  auVar116._24_4_ = uVar95;
  auVar116._28_4_ = uVar95;
  auVar184._8_4_ = 1;
  auVar184._0_8_ = 0x100000001;
  auVar184._12_4_ = 1;
  auVar184._16_4_ = 1;
  auVar184._20_4_ = 1;
  auVar184._24_4_ = 1;
  auVar184._28_4_ = 1;
  auVar78 = ZEXT1632(auVar49);
  auVar61 = vpermps_avx2(auVar184,auVar78);
  auVar68 = vbroadcastss_avx512vl(auVar48);
  auVar79 = ZEXT1632(auVar48);
  auVar62 = vpermps_avx512vl(auVar184,auVar79);
  auVar69 = vbroadcastss_avx512vl(auVar47);
  auVar76 = ZEXT1632(auVar47);
  auVar70 = vpermps_avx512vl(auVar184,auVar76);
  auVar71 = vbroadcastss_avx512vl(auVar50);
  auVar75 = ZEXT1632(auVar50);
  auVar72 = vpermps_avx512vl(auVar184,auVar75);
  auVar185._4_4_ = fVar206;
  auVar185._0_4_ = fVar206;
  auVar185._8_4_ = fVar206;
  auVar185._12_4_ = fVar206;
  auVar185._16_4_ = fVar206;
  auVar185._20_4_ = fVar206;
  auVar185._24_4_ = fVar206;
  auVar185._28_4_ = fVar206;
  auVar73 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar60 = vpermps_avx512vl(auVar73,auVar78);
  auVar158._8_4_ = 3;
  auVar158._0_8_ = 0x300000003;
  auVar158._12_4_ = 3;
  auVar158._16_4_ = 3;
  auVar158._20_4_ = 3;
  auVar158._24_4_ = 3;
  auVar158._28_4_ = 3;
  auVar58 = vpermps_avx512vl(auVar158,auVar78);
  auVar59 = vpermps_avx512vl(auVar73,auVar79);
  auVar78 = vpermps_avx2(auVar158,auVar79);
  auVar74 = vpermps_avx512vl(auVar73,auVar76);
  auVar79 = vpermps_avx2(auVar158,auVar76);
  auVar73 = vpermps_avx512vl(auVar73,auVar75);
  auVar75 = vpermps_avx512vl(auVar158,auVar75);
  auVar51 = vfmadd132ps_fma(auVar63,auVar167,_DAT_01f7b040);
  auVar63 = vsubps_avx(auVar225,ZEXT1632(auVar51));
  auVar76 = vmulps_avx512vl(auVar68,ZEXT1632(auVar51));
  auVar80 = ZEXT1632(auVar51);
  auVar77 = vmulps_avx512vl(auVar62,auVar80);
  auVar50 = vfmadd231ps_fma(auVar76,auVar63,auVar116);
  auVar49 = vfmadd231ps_fma(auVar77,auVar63,auVar61);
  auVar76 = vmulps_avx512vl(auVar69,auVar80);
  auVar77 = vmulps_avx512vl(auVar70,auVar80);
  auVar68 = vfmadd231ps_avx512vl(auVar76,auVar63,auVar68);
  auVar62 = vfmadd231ps_avx512vl(auVar77,auVar63,auVar62);
  auVar76 = vmulps_avx512vl(auVar71,auVar80);
  auVar77 = ZEXT1632(auVar51);
  auVar72 = vmulps_avx512vl(auVar72,auVar77);
  auVar69 = vfmadd231ps_avx512vl(auVar76,auVar63,auVar69);
  auVar70 = vfmadd231ps_avx512vl(auVar72,auVar63,auVar70);
  fVar199 = auVar51._0_4_;
  fVar201 = auVar51._4_4_;
  auVar18._4_4_ = fVar201 * auVar68._4_4_;
  auVar18._0_4_ = fVar199 * auVar68._0_4_;
  fVar203 = auVar51._8_4_;
  auVar18._8_4_ = fVar203 * auVar68._8_4_;
  fVar204 = auVar51._12_4_;
  auVar18._12_4_ = fVar204 * auVar68._12_4_;
  auVar18._16_4_ = auVar68._16_4_ * 0.0;
  auVar18._20_4_ = auVar68._20_4_ * 0.0;
  auVar18._24_4_ = auVar68._24_4_ * 0.0;
  auVar18._28_4_ = fVar94;
  auVar19._4_4_ = fVar201 * auVar62._4_4_;
  auVar19._0_4_ = fVar199 * auVar62._0_4_;
  auVar19._8_4_ = fVar203 * auVar62._8_4_;
  auVar19._12_4_ = fVar204 * auVar62._12_4_;
  auVar19._16_4_ = auVar62._16_4_ * 0.0;
  auVar19._20_4_ = auVar62._20_4_ * 0.0;
  auVar19._24_4_ = auVar62._24_4_ * 0.0;
  auVar19._28_4_ = auVar61._28_4_;
  auVar50 = vfmadd231ps_fma(auVar18,auVar63,ZEXT1632(auVar50));
  auVar49 = vfmadd231ps_fma(auVar19,auVar63,ZEXT1632(auVar49));
  auVar109._0_4_ = fVar199 * auVar69._0_4_;
  auVar109._4_4_ = fVar201 * auVar69._4_4_;
  auVar109._8_4_ = fVar203 * auVar69._8_4_;
  auVar109._12_4_ = fVar204 * auVar69._12_4_;
  auVar109._16_4_ = auVar69._16_4_ * 0.0;
  auVar109._20_4_ = auVar69._20_4_ * 0.0;
  auVar109._24_4_ = auVar69._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar20._4_4_ = fVar201 * auVar70._4_4_;
  auVar20._0_4_ = fVar199 * auVar70._0_4_;
  auVar20._8_4_ = fVar203 * auVar70._8_4_;
  auVar20._12_4_ = fVar204 * auVar70._12_4_;
  auVar20._16_4_ = auVar70._16_4_ * 0.0;
  auVar20._20_4_ = auVar70._20_4_ * 0.0;
  auVar20._24_4_ = auVar70._24_4_ * 0.0;
  auVar20._28_4_ = auVar69._28_4_;
  auVar48 = vfmadd231ps_fma(auVar109,auVar63,auVar68);
  auVar47 = vfmadd231ps_fma(auVar20,auVar63,auVar62);
  auVar21._28_4_ = auVar62._28_4_;
  auVar21._0_28_ =
       ZEXT1628(CONCAT412(fVar204 * auVar47._12_4_,
                          CONCAT48(fVar203 * auVar47._8_4_,
                                   CONCAT44(fVar201 * auVar47._4_4_,fVar199 * auVar47._0_4_))));
  auVar46 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar204 * auVar48._12_4_,
                                               CONCAT48(fVar203 * auVar48._8_4_,
                                                        CONCAT44(fVar201 * auVar48._4_4_,
                                                                 fVar199 * auVar48._0_4_)))),auVar63
                            ,ZEXT1632(auVar50));
  auVar45 = vfmadd231ps_fma(auVar21,auVar63,ZEXT1632(auVar49));
  auVar61 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar50));
  auVar68 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar49));
  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar61 = vmulps_avx512vl(auVar61,auVar62);
  auVar68 = vmulps_avx512vl(auVar68,auVar62);
  auVar179._0_4_ = fVar206 * auVar61._0_4_;
  auVar179._4_4_ = fVar206 * auVar61._4_4_;
  auVar179._8_4_ = fVar206 * auVar61._8_4_;
  auVar179._12_4_ = fVar206 * auVar61._12_4_;
  auVar179._16_4_ = fVar206 * auVar61._16_4_;
  auVar179._20_4_ = fVar206 * auVar61._20_4_;
  auVar179._24_4_ = fVar206 * auVar61._24_4_;
  auVar179._28_4_ = 0;
  auVar61 = vmulps_avx512vl(auVar185,auVar68);
  auVar49 = vxorps_avx512vl(auVar71._0_16_,auVar71._0_16_);
  auVar68 = vpermt2ps_avx512vl(ZEXT1632(auVar46),_DAT_01fb9fc0,ZEXT1632(auVar49));
  auVar69 = vpermt2ps_avx512vl(ZEXT1632(auVar45),_DAT_01fb9fc0,ZEXT1632(auVar49));
  auVar110._0_4_ = auVar179._0_4_ + auVar46._0_4_;
  auVar110._4_4_ = auVar179._4_4_ + auVar46._4_4_;
  auVar110._8_4_ = auVar179._8_4_ + auVar46._8_4_;
  auVar110._12_4_ = auVar179._12_4_ + auVar46._12_4_;
  auVar110._16_4_ = auVar179._16_4_ + 0.0;
  auVar110._20_4_ = auVar179._20_4_ + 0.0;
  auVar110._24_4_ = auVar179._24_4_ + 0.0;
  auVar110._28_4_ = 0;
  auVar80 = ZEXT1632(auVar49);
  auVar70 = vpermt2ps_avx512vl(auVar179,_DAT_01fb9fc0,auVar80);
  auVar71 = vaddps_avx512vl(ZEXT1632(auVar45),auVar61);
  auVar72 = vpermt2ps_avx512vl(auVar61,_DAT_01fb9fc0,auVar80);
  auVar61 = vsubps_avx(auVar68,auVar70);
  auVar70 = vsubps_avx512vl(auVar69,auVar72);
  auVar72 = vmulps_avx512vl(auVar59,auVar77);
  auVar76 = vmulps_avx512vl(auVar78,auVar77);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar63,auVar60);
  auVar60 = vfmadd231ps_avx512vl(auVar76,auVar63,auVar58);
  auVar58 = vmulps_avx512vl(auVar74,auVar77);
  auVar76 = vmulps_avx512vl(auVar79,auVar77);
  auVar58 = vfmadd231ps_avx512vl(auVar58,auVar63,auVar59);
  auVar78 = vfmadd231ps_avx512vl(auVar76,auVar63,auVar78);
  auVar73 = vmulps_avx512vl(auVar73,auVar77);
  auVar59 = vmulps_avx512vl(auVar75,auVar77);
  auVar50 = vfmadd231ps_fma(auVar73,auVar63,auVar74);
  auVar73 = vfmadd231ps_avx512vl(auVar59,auVar63,auVar79);
  auVar59 = vmulps_avx512vl(auVar77,auVar58);
  auVar75 = ZEXT1632(auVar51);
  auVar74 = vmulps_avx512vl(auVar75,auVar78);
  auVar72 = vfmadd231ps_avx512vl(auVar59,auVar63,auVar72);
  auVar60 = vfmadd231ps_avx512vl(auVar74,auVar63,auVar60);
  auVar73 = vmulps_avx512vl(auVar75,auVar73);
  auVar58 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar204 * auVar50._12_4_,
                                          CONCAT48(fVar203 * auVar50._8_4_,
                                                   CONCAT44(fVar201 * auVar50._4_4_,
                                                            fVar199 * auVar50._0_4_)))),auVar63,
                       auVar58);
  auVar78 = vfmadd231ps_avx512vl(auVar73,auVar63,auVar78);
  auVar22._4_4_ = fVar201 * auVar58._4_4_;
  auVar22._0_4_ = fVar199 * auVar58._0_4_;
  auVar22._8_4_ = fVar203 * auVar58._8_4_;
  auVar22._12_4_ = fVar204 * auVar58._12_4_;
  auVar22._16_4_ = auVar58._16_4_ * 0.0;
  auVar22._20_4_ = auVar58._20_4_ * 0.0;
  auVar22._24_4_ = auVar58._24_4_ * 0.0;
  auVar22._28_4_ = auVar79._28_4_;
  auVar79 = vmulps_avx512vl(auVar75,auVar78);
  auVar73 = vfmadd231ps_avx512vl(auVar22,auVar63,auVar72);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar60,auVar63);
  auVar63 = vsubps_avx512vl(auVar58,auVar72);
  auVar78 = vsubps_avx512vl(auVar78,auVar60);
  auVar63 = vmulps_avx512vl(auVar63,auVar62);
  auVar78 = vmulps_avx512vl(auVar78,auVar62);
  fVar94 = fVar206 * auVar63._0_4_;
  fVar199 = fVar206 * auVar63._4_4_;
  auVar23._4_4_ = fVar199;
  auVar23._0_4_ = fVar94;
  fVar201 = fVar206 * auVar63._8_4_;
  auVar23._8_4_ = fVar201;
  fVar203 = fVar206 * auVar63._12_4_;
  auVar23._12_4_ = fVar203;
  fVar204 = fVar206 * auVar63._16_4_;
  auVar23._16_4_ = fVar204;
  fVar205 = fVar206 * auVar63._20_4_;
  auVar23._20_4_ = fVar205;
  fVar206 = fVar206 * auVar63._24_4_;
  auVar23._24_4_ = fVar206;
  auVar23._28_4_ = auVar63._28_4_;
  auVar78 = vmulps_avx512vl(auVar185,auVar78);
  auVar62 = vpermt2ps_avx512vl(auVar73,_DAT_01fb9fc0,auVar80);
  auVar72 = vpermt2ps_avx512vl(auVar79,_DAT_01fb9fc0,auVar80);
  auVar186._0_4_ = auVar73._0_4_ + fVar94;
  auVar186._4_4_ = auVar73._4_4_ + fVar199;
  auVar186._8_4_ = auVar73._8_4_ + fVar201;
  auVar186._12_4_ = auVar73._12_4_ + fVar203;
  auVar186._16_4_ = auVar73._16_4_ + fVar204;
  auVar186._20_4_ = auVar73._20_4_ + fVar205;
  auVar186._24_4_ = auVar73._24_4_ + fVar206;
  auVar186._28_4_ = auVar73._28_4_ + auVar63._28_4_;
  auVar63 = vpermt2ps_avx512vl(auVar23,_DAT_01fb9fc0,ZEXT1632(auVar49));
  auVar60 = vaddps_avx512vl(auVar79,auVar78);
  auVar78 = vpermt2ps_avx512vl(auVar78,_DAT_01fb9fc0,ZEXT1632(auVar49));
  auVar63 = vsubps_avx(auVar62,auVar63);
  auVar78 = vsubps_avx512vl(auVar72,auVar78);
  in_ZMM17 = ZEXT3264(auVar78);
  auVar126 = ZEXT1632(auVar46);
  auVar58 = vsubps_avx512vl(auVar73,auVar126);
  auVar139 = ZEXT1632(auVar45);
  auVar59 = vsubps_avx512vl(auVar79,auVar139);
  auVar74 = vsubps_avx512vl(auVar62,auVar68);
  auVar58 = vaddps_avx512vl(auVar58,auVar74);
  auVar74 = vsubps_avx512vl(auVar72,auVar69);
  auVar59 = vaddps_avx512vl(auVar59,auVar74);
  auVar74 = vmulps_avx512vl(auVar139,auVar58);
  auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar126,auVar59);
  auVar75 = vmulps_avx512vl(auVar71,auVar58);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar110,auVar59);
  auVar76 = vmulps_avx512vl(auVar70,auVar58);
  auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar61,auVar59);
  auVar77 = vmulps_avx512vl(auVar69,auVar58);
  auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar68,auVar59);
  auVar80 = vmulps_avx512vl(auVar79,auVar58);
  auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar73,auVar59);
  auVar81 = vmulps_avx512vl(auVar60,auVar58);
  auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar186,auVar59);
  auVar82 = vmulps_avx512vl(auVar78,auVar58);
  auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar63,auVar59);
  auVar58 = vmulps_avx512vl(auVar72,auVar58);
  auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar62,auVar59);
  auVar59 = vminps_avx512vl(auVar74,auVar75);
  auVar74 = vmaxps_avx512vl(auVar74,auVar75);
  auVar75 = vminps_avx512vl(auVar76,auVar77);
  auVar59 = vminps_avx512vl(auVar59,auVar75);
  auVar75 = vmaxps_avx512vl(auVar76,auVar77);
  auVar74 = vmaxps_avx512vl(auVar74,auVar75);
  auVar75 = vminps_avx512vl(auVar80,auVar81);
  auVar76 = vmaxps_avx512vl(auVar80,auVar81);
  auVar77 = vminps_avx512vl(auVar82,auVar58);
  auVar75 = vminps_avx512vl(auVar75,auVar77);
  auVar59 = vminps_avx512vl(auVar59,auVar75);
  auVar58 = vmaxps_avx512vl(auVar82,auVar58);
  auVar58 = vmaxps_avx512vl(auVar76,auVar58);
  auVar58 = vmaxps_avx512vl(auVar74,auVar58);
  uVar10 = vcmpps_avx512vl(auVar59,local_b8,2);
  uVar11 = vcmpps_avx512vl(auVar58,local_d8,5);
  bVar25 = (byte)uVar10 & (byte)uVar11 & 0x7f;
  if (bVar25 != 0) {
    auVar58 = vsubps_avx512vl(auVar68,auVar126);
    auVar59 = vsubps_avx512vl(auVar69,auVar139);
    auVar74 = vsubps_avx512vl(auVar62,auVar73);
    auVar58 = vaddps_avx512vl(auVar58,auVar74);
    auVar74 = vsubps_avx512vl(auVar72,auVar79);
    auVar59 = vaddps_avx512vl(auVar59,auVar74);
    auVar74 = vmulps_avx512vl(auVar139,auVar58);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar59,auVar126);
    auVar71 = vmulps_avx512vl(auVar71,auVar58);
    auVar71 = vfnmadd213ps_avx512vl(auVar110,auVar59,auVar71);
    auVar70 = vmulps_avx512vl(auVar70,auVar58);
    auVar70 = vfnmadd213ps_avx512vl(auVar61,auVar59,auVar70);
    auVar61 = vmulps_avx512vl(auVar69,auVar58);
    auVar69 = vfnmadd231ps_avx512vl(auVar61,auVar59,auVar68);
    auVar61 = vmulps_avx512vl(auVar79,auVar58);
    auVar79 = vfnmadd231ps_avx512vl(auVar61,auVar59,auVar73);
    auVar61 = vmulps_avx512vl(auVar60,auVar58);
    auVar73 = vfnmadd213ps_avx512vl(auVar186,auVar59,auVar61);
    auVar61 = vmulps_avx512vl(auVar78,auVar58);
    auVar60 = vfnmadd213ps_avx512vl(auVar63,auVar59,auVar61);
    auVar63 = vmulps_avx512vl(auVar72,auVar58);
    auVar62 = vfnmadd231ps_avx512vl(auVar63,auVar62,auVar59);
    auVar61 = vminps_avx(auVar74,auVar71);
    auVar63 = vmaxps_avx(auVar74,auVar71);
    auVar68 = vminps_avx(auVar70,auVar69);
    auVar68 = vminps_avx(auVar61,auVar68);
    auVar61 = vmaxps_avx(auVar70,auVar69);
    auVar63 = vmaxps_avx(auVar63,auVar61);
    auVar78 = vminps_avx(auVar79,auVar73);
    auVar61 = vmaxps_avx(auVar79,auVar73);
    auVar79 = vminps_avx(auVar60,auVar62);
    auVar78 = vminps_avx(auVar78,auVar79);
    auVar78 = vminps_avx(auVar68,auVar78);
    auVar68 = vmaxps_avx(auVar60,auVar62);
    auVar61 = vmaxps_avx(auVar61,auVar68);
    auVar63 = vmaxps_avx(auVar63,auVar61);
    uVar10 = vcmpps_avx512vl(auVar63,local_d8,5);
    uVar11 = vcmpps_avx512vl(auVar78,local_b8,2);
    bVar25 = bVar25 & (byte)uVar10 & (byte)uVar11;
    if (bVar25 != 0) {
      auStack_198[uVar27] = (uint)bVar25;
      uVar10 = vmovlps_avx(auVar38);
      (&uStack_98)[uVar27] = uVar10;
      uVar33 = vmovlps_avx(auVar39);
      auStack_58[uVar27] = uVar33;
      uVar27 = (ulong)((int)uVar27 + 1);
    }
  }
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar231 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar232 = ZEXT1664(auVar38);
  auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar233 = ZEXT3264(auVar63);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar234 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar235 = ZEXT1664(auVar38);
  auVar236 = ZEXT3264(_DAT_01fb9fe0);
  auVar75._16_16_ = DAT_01fb9fe0._16_16_;
  auVar238 = ZEXT1664(local_318);
LAB_01a5e721:
  do {
    do {
      do {
        if ((int)uVar27 == 0) {
          fVar206 = (ray->super_RayK<1>).tfar;
          auVar17._4_4_ = fVar206;
          auVar17._0_4_ = fVar206;
          auVar17._8_4_ = fVar206;
          auVar17._12_4_ = fVar206;
          auVar17._16_4_ = fVar206;
          auVar17._20_4_ = fVar206;
          auVar17._24_4_ = fVar206;
          auVar17._28_4_ = fVar206;
          uVar10 = vcmpps_avx512vl(local_78,auVar17,2);
          uVar32 = (ulong)((uint)uVar32 & (uint)uVar10);
          goto LAB_01a5db6b;
        }
        uVar26 = (int)uVar27 - 1;
        uVar28 = (ulong)uVar26;
        uVar5 = auStack_198[uVar28];
        auVar39._8_8_ = 0;
        auVar39._0_8_ = auStack_58[uVar28];
        uVar33 = 0;
        for (uVar31 = (ulong)uVar5; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
          uVar33 = uVar33 + 1;
        }
        uVar30 = uVar5 - 1 & uVar5;
        bVar36 = uVar30 == 0;
        auStack_198[uVar28] = uVar30;
        if (bVar36) {
          uVar27 = (ulong)uVar26;
        }
        auVar96._8_8_ = 0;
        auVar96._0_8_ = uVar33;
        auVar38 = vpunpcklqdq_avx(auVar96,ZEXT416((int)uVar33 + 1));
        auVar38 = vcvtqq2ps_avx512vl(auVar38);
        auVar38 = vmulps_avx512vl(auVar38,auVar234._0_16_);
        uVar95 = *(undefined4 *)((long)&uStack_98 + uVar28 * 8 + 4);
        auVar12._4_4_ = uVar95;
        auVar12._0_4_ = uVar95;
        auVar12._8_4_ = uVar95;
        auVar12._12_4_ = uVar95;
        auVar51 = vmulps_avx512vl(auVar38,auVar12);
        auVar50 = auVar235._0_16_;
        auVar38 = vsubps_avx512vl(auVar50,auVar38);
        uVar95 = *(undefined4 *)(&uStack_98 + uVar28);
        auVar13._4_4_ = uVar95;
        auVar13._0_4_ = uVar95;
        auVar13._8_4_ = uVar95;
        auVar13._12_4_ = uVar95;
        auVar38 = vfmadd231ps_avx512vl(auVar51,auVar38,auVar13);
        auVar51 = vmovshdup_avx(auVar38);
        fVar206 = auVar51._0_4_ - auVar38._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar206));
        if (uVar5 == 0 || bVar36) goto LAB_01a5e224;
        auVar51 = vshufps_avx(auVar39,auVar39,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar206));
        auVar47 = vsubps_avx512vl(auVar50,auVar51);
        fVar94 = auVar51._0_4_;
        auVar134._0_4_ = fVar94 * (float)local_2b8._0_4_;
        fVar199 = auVar51._4_4_;
        auVar134._4_4_ = fVar199 * (float)local_2b8._4_4_;
        fVar201 = auVar51._8_4_;
        auVar134._8_4_ = fVar201 * fStack_2b0;
        fVar203 = auVar51._12_4_;
        auVar134._12_4_ = fVar203 * fStack_2ac;
        auVar144._0_4_ = fVar94 * (float)local_2c8._0_4_;
        auVar144._4_4_ = fVar199 * (float)local_2c8._4_4_;
        auVar144._8_4_ = fVar201 * fStack_2c0;
        auVar144._12_4_ = fVar203 * fStack_2bc;
        auVar152._0_4_ = fVar94 * (float)local_2d8._0_4_;
        auVar152._4_4_ = fVar199 * (float)local_2d8._4_4_;
        auVar152._8_4_ = fVar201 * fStack_2d0;
        auVar152._12_4_ = fVar203 * fStack_2cc;
        auVar111._0_4_ = fVar94 * (float)local_2e8._0_4_;
        auVar111._4_4_ = fVar199 * (float)local_2e8._4_4_;
        auVar111._8_4_ = fVar201 * fStack_2e0;
        auVar111._12_4_ = fVar203 * fStack_2dc;
        auVar51 = vfmadd231ps_fma(auVar134,auVar47,local_278);
        auVar49 = vfmadd231ps_fma(auVar144,auVar47,local_288);
        auVar48 = vfmadd231ps_fma(auVar152,auVar47,local_298);
        auVar47 = vfmadd231ps_fma(auVar111,auVar47,local_2a8);
        auVar127._16_16_ = auVar51;
        auVar127._0_16_ = auVar51;
        auVar140._16_16_ = auVar49;
        auVar140._0_16_ = auVar49;
        auVar148._16_16_ = auVar48;
        auVar148._0_16_ = auVar48;
        auVar61 = vpermps_avx512vl(auVar236._0_32_,ZEXT1632(auVar38));
        auVar63 = vsubps_avx(auVar140,auVar127);
        auVar49 = vfmadd213ps_fma(auVar63,auVar61,auVar127);
        auVar63 = vsubps_avx(auVar148,auVar140);
        auVar46 = vfmadd213ps_fma(auVar63,auVar61,auVar140);
        auVar51 = vsubps_avx(auVar47,auVar48);
        auVar141._16_16_ = auVar51;
        auVar141._0_16_ = auVar51;
        auVar51 = vfmadd213ps_fma(auVar141,auVar61,auVar148);
        auVar63 = vsubps_avx(ZEXT1632(auVar46),ZEXT1632(auVar49));
        auVar49 = vfmadd213ps_fma(auVar63,auVar61,ZEXT1632(auVar49));
        auVar63 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar46));
        auVar51 = vfmadd213ps_fma(auVar63,auVar61,ZEXT1632(auVar46));
        auVar63 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar49));
        auVar57 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar63,auVar61);
        auVar63 = vmulps_avx512vl(auVar63,auVar233._0_32_);
        auVar75._16_16_ = auVar63._16_16_;
        auVar51 = vmulss_avx512f(ZEXT416((uint)fVar206),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar94 = auVar51._0_4_;
        auVar153._0_8_ =
             CONCAT44(auVar57._4_4_ + fVar94 * auVar63._4_4_,auVar57._0_4_ + fVar94 * auVar63._0_4_)
        ;
        auVar153._8_4_ = auVar57._8_4_ + fVar94 * auVar63._8_4_;
        auVar153._12_4_ = auVar57._12_4_ + fVar94 * auVar63._12_4_;
        auVar135._0_4_ = fVar94 * auVar63._16_4_;
        auVar135._4_4_ = fVar94 * auVar63._20_4_;
        auVar135._8_4_ = fVar94 * auVar63._24_4_;
        auVar135._12_4_ = fVar94 * auVar63._28_4_;
        auVar42 = vsubps_avx((undefined1  [16])0x0,auVar135);
        auVar46 = vshufpd_avx(auVar57,auVar57,3);
        auVar45 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar51 = vsubps_avx(auVar46,auVar57);
        auVar49 = vsubps_avx(auVar45,(undefined1  [16])0x0);
        auVar171._0_4_ = auVar51._0_4_ + auVar49._0_4_;
        auVar171._4_4_ = auVar51._4_4_ + auVar49._4_4_;
        auVar171._8_4_ = auVar51._8_4_ + auVar49._8_4_;
        auVar171._12_4_ = auVar51._12_4_ + auVar49._12_4_;
        auVar51 = vshufps_avx(auVar57,auVar57,0xb1);
        auVar49 = vshufps_avx(auVar153,auVar153,0xb1);
        auVar48 = vshufps_avx(auVar42,auVar42,0xb1);
        auVar47 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar223._4_4_ = auVar171._0_4_;
        auVar223._0_4_ = auVar171._0_4_;
        auVar223._8_4_ = auVar171._0_4_;
        auVar223._12_4_ = auVar171._0_4_;
        auVar41 = vshufps_avx(auVar171,auVar171,0x55);
        fVar94 = auVar41._0_4_;
        auVar182._0_4_ = auVar51._0_4_ * fVar94;
        fVar199 = auVar41._4_4_;
        auVar182._4_4_ = auVar51._4_4_ * fVar199;
        fVar201 = auVar41._8_4_;
        auVar182._8_4_ = auVar51._8_4_ * fVar201;
        fVar203 = auVar41._12_4_;
        auVar182._12_4_ = auVar51._12_4_ * fVar203;
        auVar190._0_4_ = auVar49._0_4_ * fVar94;
        auVar190._4_4_ = auVar49._4_4_ * fVar199;
        auVar190._8_4_ = auVar49._8_4_ * fVar201;
        auVar190._12_4_ = auVar49._12_4_ * fVar203;
        auVar209._0_4_ = auVar48._0_4_ * fVar94;
        auVar209._4_4_ = auVar48._4_4_ * fVar199;
        auVar209._8_4_ = auVar48._8_4_ * fVar201;
        auVar209._12_4_ = auVar48._12_4_ * fVar203;
        auVar172._0_4_ = auVar47._0_4_ * fVar94;
        auVar172._4_4_ = auVar47._4_4_ * fVar199;
        auVar172._8_4_ = auVar47._8_4_ * fVar201;
        auVar172._12_4_ = auVar47._12_4_ * fVar203;
        auVar51 = vfmadd231ps_fma(auVar182,auVar223,auVar57);
        auVar49 = vfmadd231ps_fma(auVar190,auVar223,auVar153);
        auVar43 = vfmadd231ps_fma(auVar209,auVar223,auVar42);
        auVar44 = vfmadd231ps_fma(auVar172,(undefined1  [16])0x0,auVar223);
        auVar41 = vshufpd_avx(auVar51,auVar51,1);
        auVar40 = vshufpd_avx(auVar49,auVar49,1);
        auVar52 = vshufpd_avx512vl(auVar43,auVar43,1);
        auVar53 = vshufpd_avx512vl(auVar44,auVar44,1);
        in_ZMM17 = ZEXT1664(auVar53);
        auVar48 = vminss_avx(auVar51,auVar49);
        auVar51 = vmaxss_avx(auVar49,auVar51);
        auVar47 = vminss_avx(auVar43,auVar44);
        auVar49 = vmaxss_avx(auVar44,auVar43);
        auVar48 = vminss_avx(auVar48,auVar47);
        auVar51 = vmaxss_avx(auVar49,auVar51);
        auVar47 = vminss_avx(auVar41,auVar40);
        auVar49 = vmaxss_avx(auVar40,auVar41);
        auVar41 = vminss_avx512f(auVar52,auVar53);
        auVar40 = vmaxss_avx512f(auVar53,auVar52);
        auVar49 = vmaxss_avx(auVar40,auVar49);
        auVar47 = vminss_avx512f(auVar47,auVar41);
        fVar199 = auVar49._0_4_;
        fVar94 = auVar51._0_4_;
        if (auVar48._0_4_ < 0.0001) {
          bVar37 = fVar199 == -0.0001;
          bVar34 = NAN(fVar199);
          if (fVar199 <= -0.0001) goto LAB_01a5e94c;
          break;
        }
LAB_01a5e94c:
        vucomiss_avx512f(auVar47);
        bVar37 = fVar199 <= -0.0001;
        bVar35 = -0.0001 < fVar94;
        bVar34 = bVar37;
        if (!bVar37) break;
        uVar10 = vcmpps_avx512vl(auVar48,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar11 = vcmpps_avx512vl(auVar47,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar26 = (uint)uVar10 & (uint)uVar11;
        bVar24 = (uVar26 & 1) == 0;
        bVar37 = bVar35 && bVar24;
        bVar34 = bVar35 && (uVar26 & 1) == 0;
      } while (!bVar35 || !bVar24);
      auVar43 = vxorps_avx512vl(auVar237._0_16_,auVar237._0_16_);
      vcmpss_avx512f(auVar48,auVar43,1);
      uVar10 = vcmpss_avx512f(auVar51,auVar43,1);
      bVar35 = (bool)((byte)uVar10 & 1);
      auVar75._0_16_ = auVar240._0_16_;
      auVar83._4_28_ = auVar75._4_28_;
      auVar83._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar240._0_4_);
      vucomiss_avx512f(auVar83._0_16_);
      bVar34 = (bool)(!bVar37 | bVar34);
      bVar35 = bVar34 == false;
      auVar85._16_16_ = auVar75._16_16_;
      auVar85._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar84._4_28_ = auVar85._4_28_;
      auVar84._0_4_ = (uint)bVar34 * auVar43._0_4_ + (uint)!bVar34 * 0x7f800000;
      auVar40 = auVar84._0_16_;
      auVar87._16_16_ = auVar75._16_16_;
      auVar87._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar86._4_28_ = auVar87._4_28_;
      auVar86._0_4_ = (uint)bVar34 * auVar43._0_4_ + (uint)!bVar34 * -0x800000;
      auVar41 = auVar86._0_16_;
      auVar44 = vxorps_avx512vl(auVar239._0_16_,auVar239._0_16_);
      auVar239 = ZEXT1664(auVar44);
      uVar10 = vcmpss_avx512f(auVar47,auVar43,1);
      bVar37 = (bool)((byte)uVar10 & 1);
      auVar89._16_16_ = auVar75._16_16_;
      auVar89._0_16_ = auVar240._0_16_;
      auVar88._4_28_ = auVar89._4_28_;
      auVar88._0_4_ = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * auVar240._0_4_);
      auVar47 = vucomiss_avx512f(auVar88._0_16_);
      in_ZMM17 = ZEXT1664(auVar47);
      if ((bVar34) || (bVar35)) {
        auVar47 = vucomiss_avx512f(auVar48);
        if ((bVar34) || (bVar35)) {
          auVar16._8_4_ = 0x80000000;
          auVar16._0_8_ = 0x8000000080000000;
          auVar16._12_4_ = 0x80000000;
          auVar43 = vxorps_avx512vl(auVar48,auVar16);
          in_ZMM17 = ZEXT1664(auVar43);
          auVar48 = vsubss_avx512f(auVar47,auVar48);
          auVar48 = vdivss_avx512f(auVar43,auVar48);
          auVar47 = vsubss_avx512f(ZEXT416(0x3f800000),auVar48);
          auVar47 = vfmadd213ss_avx512f(auVar47,auVar44,auVar48);
          auVar48 = auVar47;
        }
        else {
          auVar48 = vxorps_avx512vl(auVar47,auVar47);
          vucomiss_avx512f(auVar48);
          auVar47 = ZEXT416(0x3f800000);
          if ((bVar34) || (bVar35)) {
            auVar47 = SUB6416(ZEXT464(0xff800000),0);
            auVar48 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar40 = vminss_avx512f(auVar40,auVar48);
        auVar41 = vmaxss_avx(auVar47,auVar41);
      }
      auVar240 = ZEXT464(0x3f800000);
      auVar237 = ZEXT1664(local_2f8);
      uVar10 = vcmpss_avx512f(auVar49,auVar44,1);
      bVar37 = (bool)((byte)uVar10 & 1);
      auVar49 = auVar240._0_16_;
      fVar201 = (float)((uint)bVar37 * -0x40800000 + (uint)!bVar37 * 0x3f800000);
      if ((auVar83._0_4_ != fVar201) || (NAN(auVar83._0_4_) || NAN(fVar201))) {
        if ((fVar199 != fVar94) || (NAN(fVar199) || NAN(fVar94))) {
          auVar15._8_4_ = 0x80000000;
          auVar15._0_8_ = 0x8000000080000000;
          auVar15._12_4_ = 0x80000000;
          auVar51 = vxorps_avx512vl(auVar51,auVar15);
          auVar173._0_4_ = auVar51._0_4_ / (fVar199 - fVar94);
          auVar173._4_12_ = auVar51._4_12_;
          auVar51 = vsubss_avx512f(auVar49,auVar173);
          auVar51 = vfmadd213ss_avx512f(auVar51,auVar44,auVar173);
          auVar48 = auVar51;
        }
        else if ((fVar94 != 0.0) ||
                (auVar51 = auVar49, auVar48 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar94))) {
          auVar51 = SUB6416(ZEXT464(0xff800000),0);
          auVar48 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar40 = vminss_avx(auVar40,auVar48);
        auVar41 = vmaxss_avx(auVar51,auVar41);
      }
      bVar37 = auVar88._0_4_ != fVar201;
      auVar51 = vminss_avx512f(auVar40,auVar49);
      auVar91._16_16_ = auVar75._16_16_;
      auVar91._0_16_ = auVar40;
      auVar90._4_28_ = auVar91._4_28_;
      auVar90._0_4_ = (uint)bVar37 * auVar51._0_4_ + (uint)!bVar37 * auVar40._0_4_;
      auVar51 = vmaxss_avx512f(auVar49,auVar41);
      auVar93._16_16_ = auVar75._16_16_;
      auVar93._0_16_ = auVar41;
      auVar92._4_28_ = auVar93._4_28_;
      auVar92._0_4_ = (uint)bVar37 * auVar51._0_4_ + (uint)!bVar37 * auVar41._0_4_;
      auVar51 = vmaxss_avx512f(auVar44,auVar90._0_16_);
      auVar48 = vminss_avx512f(auVar92._0_16_,auVar49);
    } while (auVar48._0_4_ < auVar51._0_4_);
    auVar43 = vmaxss_avx512f(auVar44,ZEXT416((uint)(auVar51._0_4_ + -0.1)));
    auVar53 = vminss_avx512f(ZEXT416((uint)(auVar48._0_4_ + 0.1)),auVar49);
    auVar112._0_8_ = auVar57._0_8_;
    auVar112._8_8_ = auVar112._0_8_;
    auVar191._8_8_ = auVar153._0_8_;
    auVar191._0_8_ = auVar153._0_8_;
    auVar210._8_8_ = auVar42._0_8_;
    auVar210._0_8_ = auVar42._0_8_;
    auVar51 = vshufpd_avx(auVar153,auVar153,3);
    auVar48 = vshufpd_avx(auVar42,auVar42,3);
    auVar47 = vshufps_avx(auVar43,auVar53,0);
    auVar42 = vsubps_avx512vl(auVar50,auVar47);
    fVar94 = auVar47._0_4_;
    auVar145._0_4_ = fVar94 * auVar46._0_4_;
    fVar199 = auVar47._4_4_;
    auVar145._4_4_ = fVar199 * auVar46._4_4_;
    fVar201 = auVar47._8_4_;
    auVar145._8_4_ = fVar201 * auVar46._8_4_;
    fVar203 = auVar47._12_4_;
    auVar145._12_4_ = fVar203 * auVar46._12_4_;
    auVar154._0_4_ = fVar94 * auVar51._0_4_;
    auVar154._4_4_ = fVar199 * auVar51._4_4_;
    auVar154._8_4_ = fVar201 * auVar51._8_4_;
    auVar154._12_4_ = fVar203 * auVar51._12_4_;
    auVar226._0_4_ = auVar48._0_4_ * fVar94;
    auVar226._4_4_ = auVar48._4_4_ * fVar199;
    auVar226._8_4_ = auVar48._8_4_ * fVar201;
    auVar226._12_4_ = auVar48._12_4_ * fVar203;
    auVar136._0_4_ = fVar94 * auVar45._0_4_;
    auVar136._4_4_ = fVar199 * auVar45._4_4_;
    auVar136._8_4_ = fVar201 * auVar45._8_4_;
    auVar136._12_4_ = fVar203 * auVar45._12_4_;
    auVar45 = vfmadd231ps_fma(auVar145,auVar42,auVar112);
    auVar41 = vfmadd231ps_fma(auVar154,auVar42,auVar191);
    auVar40 = vfmadd231ps_fma(auVar226,auVar42,auVar210);
    auVar42 = vfmadd231ps_fma(auVar136,auVar42,ZEXT816(0));
    auVar48 = vsubss_avx512f(auVar49,auVar43);
    auVar51 = vmovshdup_avx(auVar39);
    auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar43._0_4_)),auVar39,auVar48);
    auVar48 = vsubss_avx512f(auVar49,auVar53);
    auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar53._0_4_)),auVar39,auVar48);
    auVar39 = vdivss_avx512f(auVar49,ZEXT416((uint)fVar206));
    auVar51 = vsubps_avx(auVar41,auVar45);
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar47 = vmulps_avx512vl(auVar51,auVar43);
    auVar51 = vsubps_avx(auVar40,auVar41);
    auVar46 = vmulps_avx512vl(auVar51,auVar43);
    auVar51 = vsubps_avx(auVar42,auVar40);
    auVar51 = vmulps_avx512vl(auVar51,auVar43);
    auVar48 = vminps_avx(auVar46,auVar51);
    auVar51 = vmaxps_avx(auVar46,auVar51);
    auVar48 = vminps_avx(auVar47,auVar48);
    auVar51 = vmaxps_avx(auVar47,auVar51);
    auVar47 = vshufpd_avx(auVar48,auVar48,3);
    auVar46 = vshufpd_avx(auVar51,auVar51,3);
    auVar48 = vminps_avx(auVar48,auVar47);
    auVar51 = vmaxps_avx(auVar51,auVar46);
    fVar206 = auVar39._0_4_;
    auVar174._0_4_ = auVar48._0_4_ * fVar206;
    auVar174._4_4_ = auVar48._4_4_ * fVar206;
    auVar174._8_4_ = auVar48._8_4_ * fVar206;
    auVar174._12_4_ = auVar48._12_4_ * fVar206;
    auVar163._0_4_ = fVar206 * auVar51._0_4_;
    auVar163._4_4_ = fVar206 * auVar51._4_4_;
    auVar163._8_4_ = fVar206 * auVar51._8_4_;
    auVar163._12_4_ = fVar206 * auVar51._12_4_;
    auVar39 = vdivss_avx512f(auVar49,ZEXT416((uint)(auVar53._0_4_ - auVar52._0_4_)));
    auVar51 = vshufpd_avx(auVar45,auVar45,3);
    auVar48 = vshufpd_avx(auVar41,auVar41,3);
    auVar47 = vshufpd_avx(auVar40,auVar40,3);
    auVar46 = vshufpd_avx(auVar42,auVar42,3);
    auVar51 = vsubps_avx(auVar51,auVar45);
    auVar45 = vsubps_avx(auVar48,auVar41);
    auVar41 = vsubps_avx(auVar47,auVar40);
    auVar46 = vsubps_avx(auVar46,auVar42);
    auVar48 = vminps_avx(auVar51,auVar45);
    auVar51 = vmaxps_avx(auVar51,auVar45);
    auVar47 = vminps_avx(auVar41,auVar46);
    auVar47 = vminps_avx(auVar48,auVar47);
    auVar48 = vmaxps_avx(auVar41,auVar46);
    auVar51 = vmaxps_avx(auVar51,auVar48);
    fVar206 = auVar39._0_4_;
    auVar211._0_4_ = fVar206 * auVar47._0_4_;
    auVar211._4_4_ = fVar206 * auVar47._4_4_;
    auVar211._8_4_ = fVar206 * auVar47._8_4_;
    auVar211._12_4_ = fVar206 * auVar47._12_4_;
    auVar192._0_4_ = fVar206 * auVar51._0_4_;
    auVar192._4_4_ = fVar206 * auVar51._4_4_;
    auVar192._8_4_ = fVar206 * auVar51._8_4_;
    auVar192._12_4_ = fVar206 * auVar51._12_4_;
    auVar46 = vinsertps_avx(auVar38,auVar52,0x10);
    auVar54 = vpermt2ps_avx512vl(auVar38,_DAT_01fb9f90,auVar53);
    auVar101._0_4_ = auVar46._0_4_ + auVar54._0_4_;
    auVar101._4_4_ = auVar46._4_4_ + auVar54._4_4_;
    auVar101._8_4_ = auVar46._8_4_ + auVar54._8_4_;
    auVar101._12_4_ = auVar46._12_4_ + auVar54._12_4_;
    auVar42 = vmulps_avx512vl(auVar101,auVar231._0_16_);
    auVar48 = vshufps_avx(auVar42,auVar42,0x54);
    uVar95 = auVar42._0_4_;
    auVar106._4_4_ = uVar95;
    auVar106._0_4_ = uVar95;
    auVar106._8_4_ = uVar95;
    auVar106._12_4_ = uVar95;
    auVar41 = vfmadd213ps_avx512vl(auVar238._0_16_,auVar106,local_2f8);
    auVar47 = vfmadd213ps_fma(local_e8,auVar106,local_258);
    auVar45 = vfmadd213ps_fma(local_f8,auVar106,local_268);
    auVar51 = vsubps_avx(auVar47,auVar41);
    auVar41 = vfmadd213ps_fma(auVar51,auVar106,auVar41);
    auVar51 = vsubps_avx(auVar45,auVar47);
    auVar51 = vfmadd213ps_fma(auVar51,auVar106,auVar47);
    auVar51 = vsubps_avx(auVar51,auVar41);
    auVar47 = vfmadd231ps_fma(auVar41,auVar51,auVar106);
    auVar39 = vmulps_avx512vl(auVar51,auVar43);
    auVar218._8_8_ = auVar47._0_8_;
    auVar218._0_8_ = auVar47._0_8_;
    auVar51 = vshufpd_avx(auVar47,auVar47,3);
    auVar47 = vshufps_avx(auVar42,auVar42,0x55);
    auVar45 = vsubps_avx(auVar51,auVar218);
    auVar41 = vfmadd231ps_fma(auVar218,auVar47,auVar45);
    auVar227._8_8_ = auVar39._0_8_;
    auVar227._0_8_ = auVar39._0_8_;
    auVar51 = vshufpd_avx(auVar39,auVar39,3);
    auVar51 = vsubps_avx512vl(auVar51,auVar227);
    auVar51 = vfmadd213ps_avx512vl(auVar51,auVar47,auVar227);
    auVar47 = vxorps_avx512vl(auVar45,auVar241._0_16_);
    auVar39 = vmovshdup_avx512vl(auVar51);
    auVar40 = vxorps_avx512vl(auVar39,auVar241._0_16_);
    auVar43 = vmovshdup_avx512vl(auVar45);
    auVar40 = vpermt2ps_avx512vl(auVar40,ZEXT416(5),auVar45);
    auVar237 = ZEXT1664(local_2f8);
    auVar45 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar39._0_4_ * auVar45._0_4_)),auVar51,auVar43);
    auVar47 = vpermt2ps_avx512vl(auVar51,SUB6416(ZEXT464(4),0),auVar47);
    auVar137._0_4_ = auVar45._0_4_;
    auVar137._4_4_ = auVar137._0_4_;
    auVar137._8_4_ = auVar137._0_4_;
    auVar137._12_4_ = auVar137._0_4_;
    auVar51 = vdivps_avx(auVar40,auVar137);
    auVar55 = vdivps_avx512vl(auVar47,auVar137);
    fVar206 = auVar41._0_4_;
    auVar47 = vshufps_avx(auVar41,auVar41,0x55);
    auVar219._0_4_ = fVar206 * auVar51._0_4_ + auVar47._0_4_ * auVar55._0_4_;
    auVar219._4_4_ = fVar206 * auVar51._4_4_ + auVar47._4_4_ * auVar55._4_4_;
    auVar219._8_4_ = fVar206 * auVar51._8_4_ + auVar47._8_4_ * auVar55._8_4_;
    auVar219._12_4_ = fVar206 * auVar51._12_4_ + auVar47._12_4_ * auVar55._12_4_;
    auVar43 = vsubps_avx(auVar48,auVar219);
    auVar47 = vmovshdup_avx(auVar51);
    auVar48 = vinsertps_avx(auVar174,auVar211,0x1c);
    auVar228._0_4_ = auVar47._0_4_ * auVar48._0_4_;
    auVar228._4_4_ = auVar47._4_4_ * auVar48._4_4_;
    auVar228._8_4_ = auVar47._8_4_ * auVar48._8_4_;
    auVar228._12_4_ = auVar47._12_4_ * auVar48._12_4_;
    auVar57 = vinsertps_avx512f(auVar163,auVar192,0x1c);
    auVar47 = vmulps_avx512vl(auVar47,auVar57);
    auVar40 = vminps_avx512vl(auVar228,auVar47);
    auVar41 = vmaxps_avx(auVar47,auVar228);
    auVar39 = vmovshdup_avx(auVar55);
    auVar47 = vinsertps_avx(auVar211,auVar174,0x4c);
    auVar212._0_4_ = auVar39._0_4_ * auVar47._0_4_;
    auVar212._4_4_ = auVar39._4_4_ * auVar47._4_4_;
    auVar212._8_4_ = auVar39._8_4_ * auVar47._8_4_;
    auVar212._12_4_ = auVar39._12_4_ * auVar47._12_4_;
    auVar45 = vinsertps_avx(auVar192,auVar163,0x4c);
    auVar193._0_4_ = auVar39._0_4_ * auVar45._0_4_;
    auVar193._4_4_ = auVar39._4_4_ * auVar45._4_4_;
    auVar193._8_4_ = auVar39._8_4_ * auVar45._8_4_;
    auVar193._12_4_ = auVar39._12_4_ * auVar45._12_4_;
    auVar39 = vminps_avx(auVar212,auVar193);
    auVar40 = vaddps_avx512vl(auVar40,auVar39);
    auVar39 = vmaxps_avx(auVar193,auVar212);
    auVar194._0_4_ = auVar41._0_4_ + auVar39._0_4_;
    auVar194._4_4_ = auVar41._4_4_ + auVar39._4_4_;
    auVar194._8_4_ = auVar41._8_4_ + auVar39._8_4_;
    auVar194._12_4_ = auVar41._12_4_ + auVar39._12_4_;
    auVar213._8_8_ = 0x3f80000000000000;
    auVar213._0_8_ = 0x3f80000000000000;
    auVar41 = vsubps_avx(auVar213,auVar194);
    auVar39 = vsubps_avx(auVar213,auVar40);
    auVar40 = vsubps_avx(auVar46,auVar42);
    auVar42 = vsubps_avx(auVar54,auVar42);
    fVar203 = auVar40._0_4_;
    auVar229._0_4_ = fVar203 * auVar41._0_4_;
    fVar204 = auVar40._4_4_;
    auVar229._4_4_ = fVar204 * auVar41._4_4_;
    fVar205 = auVar40._8_4_;
    auVar229._8_4_ = fVar205 * auVar41._8_4_;
    fVar100 = auVar40._12_4_;
    auVar229._12_4_ = fVar100 * auVar41._12_4_;
    auVar56 = vbroadcastss_avx512vl(auVar51);
    auVar48 = vmulps_avx512vl(auVar56,auVar48);
    auVar57 = vmulps_avx512vl(auVar56,auVar57);
    auVar56 = vminps_avx512vl(auVar48,auVar57);
    auVar57 = vmaxps_avx512vl(auVar57,auVar48);
    auVar48 = vbroadcastss_avx512vl(auVar55);
    auVar47 = vmulps_avx512vl(auVar48,auVar47);
    auVar48 = vmulps_avx512vl(auVar48,auVar45);
    auVar45 = vminps_avx512vl(auVar47,auVar48);
    auVar45 = vaddps_avx512vl(auVar56,auVar45);
    auVar40 = vmulps_avx512vl(auVar40,auVar39);
    in_ZMM17 = ZEXT1664(auVar40);
    fVar206 = auVar42._0_4_;
    auVar195._0_4_ = fVar206 * auVar41._0_4_;
    fVar94 = auVar42._4_4_;
    auVar195._4_4_ = fVar94 * auVar41._4_4_;
    fVar199 = auVar42._8_4_;
    auVar195._8_4_ = fVar199 * auVar41._8_4_;
    fVar201 = auVar42._12_4_;
    auVar195._12_4_ = fVar201 * auVar41._12_4_;
    auVar214._0_4_ = fVar206 * auVar39._0_4_;
    auVar214._4_4_ = fVar94 * auVar39._4_4_;
    auVar214._8_4_ = fVar199 * auVar39._8_4_;
    auVar214._12_4_ = fVar201 * auVar39._12_4_;
    auVar48 = vmaxps_avx(auVar48,auVar47);
    auVar164._0_4_ = auVar57._0_4_ + auVar48._0_4_;
    auVar164._4_4_ = auVar57._4_4_ + auVar48._4_4_;
    auVar164._8_4_ = auVar57._8_4_ + auVar48._8_4_;
    auVar164._12_4_ = auVar57._12_4_ + auVar48._12_4_;
    auVar175._8_8_ = 0x3f800000;
    auVar175._0_8_ = 0x3f800000;
    auVar48 = vsubps_avx(auVar175,auVar164);
    auVar47 = vsubps_avx512vl(auVar175,auVar45);
    auVar224._0_4_ = fVar203 * auVar48._0_4_;
    auVar224._4_4_ = fVar204 * auVar48._4_4_;
    auVar224._8_4_ = fVar205 * auVar48._8_4_;
    auVar224._12_4_ = fVar100 * auVar48._12_4_;
    auVar220._0_4_ = fVar203 * auVar47._0_4_;
    auVar220._4_4_ = fVar204 * auVar47._4_4_;
    auVar220._8_4_ = fVar205 * auVar47._8_4_;
    auVar220._12_4_ = fVar100 * auVar47._12_4_;
    auVar165._0_4_ = fVar206 * auVar48._0_4_;
    auVar165._4_4_ = fVar94 * auVar48._4_4_;
    auVar165._8_4_ = fVar199 * auVar48._8_4_;
    auVar165._12_4_ = fVar201 * auVar48._12_4_;
    auVar176._0_4_ = fVar206 * auVar47._0_4_;
    auVar176._4_4_ = fVar94 * auVar47._4_4_;
    auVar176._8_4_ = fVar199 * auVar47._8_4_;
    auVar176._12_4_ = fVar201 * auVar47._12_4_;
    auVar48 = vminps_avx(auVar224,auVar220);
    auVar47 = vminps_avx512vl(auVar165,auVar176);
    auVar45 = vminps_avx512vl(auVar48,auVar47);
    auVar48 = vmaxps_avx(auVar220,auVar224);
    auVar47 = vmaxps_avx(auVar176,auVar165);
    auVar47 = vmaxps_avx(auVar47,auVar48);
    auVar41 = vminps_avx512vl(auVar229,auVar40);
    auVar48 = vminps_avx(auVar195,auVar214);
    auVar48 = vminps_avx(auVar41,auVar48);
    auVar48 = vhaddps_avx(auVar45,auVar48);
    auVar41 = vmaxps_avx512vl(auVar40,auVar229);
    auVar45 = vmaxps_avx(auVar214,auVar195);
    auVar45 = vmaxps_avx(auVar45,auVar41);
    auVar47 = vhaddps_avx(auVar47,auVar45);
    auVar48 = vshufps_avx(auVar48,auVar48,0xe8);
    auVar47 = vshufps_avx(auVar47,auVar47,0xe8);
    auVar166._0_4_ = auVar48._0_4_ + auVar43._0_4_;
    auVar166._4_4_ = auVar48._4_4_ + auVar43._4_4_;
    auVar166._8_4_ = auVar48._8_4_ + auVar43._8_4_;
    auVar166._12_4_ = auVar48._12_4_ + auVar43._12_4_;
    auVar177._0_4_ = auVar47._0_4_ + auVar43._0_4_;
    auVar177._4_4_ = auVar47._4_4_ + auVar43._4_4_;
    auVar177._8_4_ = auVar47._8_4_ + auVar43._8_4_;
    auVar177._12_4_ = auVar47._12_4_ + auVar43._12_4_;
    auVar48 = vmaxps_avx(auVar46,auVar166);
    auVar47 = vminps_avx(auVar177,auVar54);
    uVar33 = vcmpps_avx512vl(auVar47,auVar48,1);
  } while ((uVar33 & 3) != 0);
  uVar33 = vcmpps_avx512vl(auVar177,auVar54,1);
  uVar10 = vcmpps_avx512vl(auVar38,auVar166,1);
  if (((ushort)uVar10 & (ushort)uVar33 & 1) == 0) {
    bVar25 = 0;
  }
  else {
    auVar48 = vmovshdup_avx(auVar166);
    bVar25 = auVar52._0_4_ < auVar48._0_4_ & (byte)(uVar33 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar27 || uVar5 != 0 && !bVar36) | bVar25) != 1) goto LAB_01a5f5ba;
  lVar29 = 0xc9;
  do {
    lVar29 = lVar29 + -1;
    if (lVar29 == 0) goto LAB_01a5e721;
    auVar38 = vsubss_avx512f(auVar49,auVar43);
    fVar199 = auVar38._0_4_;
    fVar206 = fVar199 * fVar199 * fVar199;
    fVar201 = auVar43._0_4_;
    fVar94 = fVar201 * 3.0 * fVar199 * fVar199;
    fVar199 = fVar199 * fVar201 * fVar201 * 3.0;
    auVar124._4_4_ = fVar206;
    auVar124._0_4_ = fVar206;
    auVar124._8_4_ = fVar206;
    auVar124._12_4_ = fVar206;
    auVar113._4_4_ = fVar94;
    auVar113._0_4_ = fVar94;
    auVar113._8_4_ = fVar94;
    auVar113._12_4_ = fVar94;
    auVar97._4_4_ = fVar199;
    auVar97._0_4_ = fVar199;
    auVar97._8_4_ = fVar199;
    auVar97._12_4_ = fVar199;
    fVar201 = fVar201 * fVar201 * fVar201;
    auVar146._0_4_ = (float)local_108._0_4_ * fVar201;
    auVar146._4_4_ = (float)local_108._4_4_ * fVar201;
    auVar146._8_4_ = fStack_100 * fVar201;
    auVar146._12_4_ = fStack_fc * fVar201;
    auVar38 = vfmadd231ps_fma(auVar146,local_268,auVar97);
    auVar38 = vfmadd231ps_fma(auVar38,local_258,auVar113);
    auVar38 = vfmadd231ps_avx512vl(auVar38,local_2f8,auVar124);
    auVar98._8_8_ = auVar38._0_8_;
    auVar98._0_8_ = auVar38._0_8_;
    auVar38 = vshufpd_avx(auVar38,auVar38,3);
    auVar48 = vshufps_avx(auVar43,auVar43,0x55);
    auVar38 = vsubps_avx(auVar38,auVar98);
    auVar48 = vfmadd213ps_fma(auVar38,auVar48,auVar98);
    fVar206 = auVar48._0_4_;
    auVar38 = vshufps_avx(auVar48,auVar48,0x55);
    auVar99._0_4_ = auVar51._0_4_ * fVar206 + auVar55._0_4_ * auVar38._0_4_;
    auVar99._4_4_ = auVar51._4_4_ * fVar206 + auVar55._4_4_ * auVar38._4_4_;
    auVar99._8_4_ = auVar51._8_4_ * fVar206 + auVar55._8_4_ * auVar38._8_4_;
    auVar99._12_4_ = auVar51._12_4_ * fVar206 + auVar55._12_4_ * auVar38._12_4_;
    auVar43 = vsubps_avx(auVar43,auVar99);
    auVar38 = vandps_avx512vl(auVar48,auVar232._0_16_);
    auVar48 = vprolq_avx512vl(auVar38,0x20);
    auVar38 = vmaxss_avx(auVar48,auVar38);
    bVar36 = (float)local_118._0_4_ < auVar38._0_4_;
  } while ((float)local_118._0_4_ <= auVar38._0_4_);
  auVar38 = vucomiss_avx512f(auVar44);
  if (bVar36) goto LAB_01a5e721;
  auVar51 = vucomiss_avx512f(auVar38);
  auVar240 = ZEXT1664(auVar51);
  if (bVar36) goto LAB_01a5e721;
  vmovshdup_avx(auVar38);
  auVar51 = vucomiss_avx512f(auVar44);
  if (bVar36) goto LAB_01a5e721;
  auVar49 = vucomiss_avx512f(auVar51);
  auVar240 = ZEXT1664(auVar49);
  if (bVar36) goto LAB_01a5e721;
  auVar48 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar42 = vinsertps_avx(auVar48,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar1 = (ray->super_RayK<1>).org.field_0;
  auVar48 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  auVar48 = vdpps_avx(auVar48,auVar42,0x7f);
  auVar47 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
  auVar47 = vdpps_avx(auVar47,auVar42,0x7f);
  auVar46 = vsubps_avx(local_1f8,(undefined1  [16])aVar1);
  auVar46 = vdpps_avx(auVar46,auVar42,0x7f);
  auVar45 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  auVar45 = vdpps_avx(auVar45,auVar42,0x7f);
  auVar41 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  auVar41 = vdpps_avx(auVar41,auVar42,0x7f);
  auVar39 = vsubps_avx(_local_208,(undefined1  [16])aVar1);
  auVar39 = vdpps_avx(auVar39,auVar42,0x7f);
  auVar40 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
  auVar40 = vdpps_avx(auVar40,auVar42,0x7f);
  auVar43 = vsubps_avx(_local_1d8,(undefined1  [16])aVar1);
  auVar42 = vdpps_avx(auVar43,auVar42,0x7f);
  auVar43 = vsubss_avx512f(auVar49,auVar51);
  fVar206 = auVar51._0_4_;
  auVar51 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * fVar206)),auVar43,auVar48);
  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * fVar206)),auVar43,auVar47);
  auVar47 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * fVar206)),auVar43,auVar46);
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar42._0_4_)),auVar43,auVar45);
  auVar49 = vsubss_avx512f(auVar49,auVar38);
  auVar147._0_4_ = auVar49._0_4_;
  fVar206 = auVar147._0_4_ * auVar147._0_4_ * auVar147._0_4_;
  fVar203 = auVar38._0_4_;
  fVar94 = fVar203 * 3.0 * auVar147._0_4_ * auVar147._0_4_;
  fVar199 = auVar147._0_4_ * fVar203 * fVar203 * 3.0;
  fVar204 = fVar203 * fVar203 * fVar203;
  auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * auVar46._0_4_)),ZEXT416((uint)fVar199),auVar47)
  ;
  auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar94),auVar48);
  auVar51 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar206),auVar51);
  fVar201 = auVar51._0_4_;
  if ((fVar201 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
     (fVar205 = (ray->super_RayK<1>).tfar, fVar205 < fVar201)) goto LAB_01a5e721;
  auVar51 = vshufps_avx(auVar38,auVar38,0x55);
  auVar48 = vsubps_avx512vl(auVar50,auVar51);
  fVar100 = auVar51._0_4_;
  auVar178._0_4_ = fVar100 * (float)local_1b8._0_4_;
  fVar102 = auVar51._4_4_;
  auVar178._4_4_ = fVar102 * (float)local_1b8._4_4_;
  fVar117 = auVar51._8_4_;
  auVar178._8_4_ = fVar117 * fStack_1b0;
  fVar118 = auVar51._12_4_;
  auVar178._12_4_ = fVar118 * fStack_1ac;
  auVar183._0_4_ = fVar100 * (float)local_208._0_4_;
  auVar183._4_4_ = fVar102 * (float)local_208._4_4_;
  auVar183._8_4_ = fVar117 * fStack_200;
  auVar183._12_4_ = fVar118 * fStack_1fc;
  auVar196._0_4_ = fVar100 * (float)local_218._0_4_;
  auVar196._4_4_ = fVar102 * (float)local_218._4_4_;
  auVar196._8_4_ = fVar117 * fStack_210;
  auVar196._12_4_ = fVar118 * fStack_20c;
  auVar155._0_4_ = fVar100 * (float)local_1d8._0_4_;
  auVar155._4_4_ = fVar102 * (float)local_1d8._4_4_;
  auVar155._8_4_ = fVar117 * fStack_1d0;
  auVar155._12_4_ = fVar118 * fStack_1cc;
  auVar51 = vfmadd231ps_fma(auVar178,auVar48,local_1a8);
  auVar50 = vfmadd231ps_fma(auVar183,auVar48,local_1e8);
  auVar49 = vfmadd231ps_fma(auVar196,auVar48,local_1f8);
  auVar48 = vfmadd231ps_fma(auVar155,auVar48,local_1c8);
  auVar51 = vsubps_avx(auVar50,auVar51);
  auVar50 = vsubps_avx(auVar49,auVar50);
  auVar49 = vsubps_avx(auVar48,auVar49);
  auVar197._0_4_ = fVar203 * auVar50._0_4_;
  auVar197._4_4_ = fVar203 * auVar50._4_4_;
  auVar197._8_4_ = fVar203 * auVar50._8_4_;
  auVar197._12_4_ = fVar203 * auVar50._12_4_;
  auVar147._4_4_ = auVar147._0_4_;
  auVar147._8_4_ = auVar147._0_4_;
  auVar147._12_4_ = auVar147._0_4_;
  auVar51 = vfmadd231ps_fma(auVar197,auVar147,auVar51);
  auVar156._0_4_ = fVar203 * auVar49._0_4_;
  auVar156._4_4_ = fVar203 * auVar49._4_4_;
  auVar156._8_4_ = fVar203 * auVar49._8_4_;
  auVar156._12_4_ = fVar203 * auVar49._12_4_;
  auVar50 = vfmadd231ps_fma(auVar156,auVar147,auVar50);
  auVar157._0_4_ = fVar203 * auVar50._0_4_;
  auVar157._4_4_ = fVar203 * auVar50._4_4_;
  auVar157._8_4_ = fVar203 * auVar50._8_4_;
  auVar157._12_4_ = fVar203 * auVar50._12_4_;
  auVar51 = vfmadd231ps_fma(auVar157,auVar147,auVar51);
  auVar14._8_4_ = 0x40400000;
  auVar14._0_8_ = 0x4040000040400000;
  auVar14._12_4_ = 0x40400000;
  auVar51 = vmulps_avx512vl(auVar51,auVar14);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  if ((pGVar6->mask & (ray->super_RayK<1>).mask) == 0) goto LAB_01a5e721;
  auVar138._0_4_ = fVar204 * (float)local_158._0_4_;
  auVar138._4_4_ = fVar204 * (float)local_158._4_4_;
  auVar138._8_4_ = fVar204 * fStack_150;
  auVar138._12_4_ = fVar204 * fStack_14c;
  auVar125._4_4_ = fVar199;
  auVar125._0_4_ = fVar199;
  auVar125._8_4_ = fVar199;
  auVar125._12_4_ = fVar199;
  auVar50 = vfmadd132ps_fma(auVar125,auVar138,local_148);
  auVar114._4_4_ = fVar94;
  auVar114._0_4_ = fVar94;
  auVar114._8_4_ = fVar94;
  auVar114._12_4_ = fVar94;
  auVar50 = vfmadd132ps_fma(auVar114,auVar50,local_138);
  auVar107._4_4_ = fVar206;
  auVar107._0_4_ = fVar206;
  auVar107._8_4_ = fVar206;
  auVar107._12_4_ = fVar206;
  auVar48 = vfmadd132ps_fma(auVar107,auVar50,local_128);
  auVar50 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar49 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar108._0_4_ = auVar48._0_4_ * auVar49._0_4_;
  auVar108._4_4_ = auVar48._4_4_ * auVar49._4_4_;
  auVar108._8_4_ = auVar48._8_4_ * auVar49._8_4_;
  auVar108._12_4_ = auVar48._12_4_ * auVar49._12_4_;
  auVar50 = vfmsub231ps_fma(auVar108,auVar51,auVar50);
  auVar51 = vshufps_avx(auVar50,auVar50,0xe9);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = fVar201;
    uVar10 = vmovlps_avx(auVar51);
    *(undefined8 *)&(ray->Ng).field_0 = uVar10;
    (ray->Ng).field_0.field_0.z = auVar50._0_4_;
    uVar10 = vmovlps_avx(auVar38);
    ray->u = (float)(int)uVar10;
    ray->v = (float)(int)((ulong)uVar10 >> 0x20);
    ray->primID = (uint)local_300;
    ray->geomID = uVar4;
    ray->instID[0] = context->user->instID[0];
    ray->instPrimID[0] = context->user->instPrimID[0];
    goto LAB_01a5e721;
  }
  local_188 = vmovlps_avx(auVar51);
  local_180 = auVar50._0_4_;
  local_17c = vmovlps_avx(auVar38);
  local_174 = (uint)local_300;
  local_170 = uVar4;
  local_16c = context->user->instID[0];
  local_168 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = fVar201;
  local_31c = -1;
  local_248.valid = &local_31c;
  local_248.geometryUserPtr = pGVar6->userPtr;
  local_248.context = context->user;
  local_248.ray = (RTCRayN *)ray;
  local_248.hit = (RTCHitN *)&local_188;
  local_248.N = 1;
  if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    (*pGVar6->intersectionFilterN)(&local_248);
    auVar238 = ZEXT1664(local_318);
    auVar240 = ZEXT464(0x3f800000);
    auVar236 = ZEXT3264(_DAT_01fb9fe0);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar235 = ZEXT1664(auVar38);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar234 = ZEXT1664(auVar38);
    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar233 = ZEXT3264(auVar63);
    auVar75._16_16_ = auVar63._16_16_;
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar232 = ZEXT1664(auVar38);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar231 = ZEXT1664(auVar38);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar241 = ZEXT1664(auVar38);
    if (*local_248.valid == 0) goto LAB_01a5f5a9;
  }
  p_Var7 = context->args->filter;
  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
    (*p_Var7)(&local_248);
    auVar238 = ZEXT1664(local_318);
    auVar240 = ZEXT464(0x3f800000);
    auVar236 = ZEXT3264(_DAT_01fb9fe0);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar235 = ZEXT1664(auVar38);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar234 = ZEXT1664(auVar38);
    auVar63 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar233 = ZEXT3264(auVar63);
    auVar75._16_16_ = auVar63._16_16_;
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar232 = ZEXT1664(auVar38);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar231 = ZEXT1664(auVar38);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar241 = ZEXT1664(auVar38);
    if (*local_248.valid == 0) {
LAB_01a5f5a9:
      auVar240 = ZEXT464(0x3f800000);
      (ray->super_RayK<1>).tfar = fVar205;
      goto LAB_01a5e721;
    }
  }
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).components[0] = *(float *)local_248.hit;
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.y = *(float *)(local_248.hit + 4);
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.z = *(float *)(local_248.hit + 8);
  *(float *)((long)local_248.ray + 0x3c) = *(float *)(local_248.hit + 0xc);
  *(float *)((long)local_248.ray + 0x40) = *(float *)(local_248.hit + 0x10);
  *(float *)((long)local_248.ray + 0x44) = *(float *)(local_248.hit + 0x14);
  *(float *)((long)local_248.ray + 0x48) = *(float *)(local_248.hit + 0x18);
  *(float *)((long)local_248.ray + 0x4c) = *(float *)(local_248.hit + 0x1c);
  *(float *)((long)local_248.ray + 0x50) = *(float *)(local_248.hit + 0x20);
  goto LAB_01a5e721;
LAB_01a5f5ba:
  auVar39 = vinsertps_avx(auVar52,auVar53,0x10);
  goto LAB_01a5e224;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }